

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [12];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  ulong uVar94;
  byte unaff_BL;
  long lVar95;
  undefined4 uVar96;
  ulong uVar97;
  ulong uVar98;
  float fVar99;
  float fVar126;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar100;
  undefined1 auVar110 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 extraout_var [60];
  undefined1 auVar125 [64];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar135 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar141 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar163 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  vint4 ai_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar209;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar210;
  float fVar219;
  float fVar220;
  vint4 bi;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar227;
  undefined1 auVar225 [16];
  float fVar228;
  undefined1 auVar226 [32];
  float fVar229;
  undefined1 auVar233 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar230 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar245;
  float fVar257;
  float fVar258;
  vint4 ai_1;
  undefined1 auVar248 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar259;
  float fVar260;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  float s;
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float t;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar279 [16];
  float fVar273;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar271 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  float fVar288;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar293 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [28];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar306 [16];
  float fVar310;
  float fVar311;
  float fVar312;
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_bb1;
  undefined1 local_ba0 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  ulong local_af0;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 *local_9b8;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  uint uStack_704;
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  RTCHitN local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  uint local_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint uStack_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  ulong local_620;
  undefined1 auStack_618 [24];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar272 [64];
  undefined1 auVar278 [16];
  
  PVar2 = prim[1];
  uVar94 = (ulong)(byte)PVar2;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar99 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar101._0_4_ = fVar99 * auVar5._0_4_;
  auVar101._4_4_ = fVar99 * auVar5._4_4_;
  auVar101._8_4_ = fVar99 * auVar5._8_4_;
  auVar101._12_4_ = fVar99 * auVar5._12_4_;
  auVar211._0_4_ = fVar99 * auVar110._0_4_;
  auVar211._4_4_ = fVar99 * auVar110._4_4_;
  auVar211._8_4_ = fVar99 * auVar110._8_4_;
  auVar211._12_4_ = fVar99 * auVar110._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar279 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar279 = vcvtdq2ps_avx(auVar279);
  auVar306 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 6)));
  auVar306 = vcvtdq2ps_avx(auVar306);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar94 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  uVar97 = (ulong)(uint)((int)(uVar94 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar94 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar97 = (ulong)(uint)((int)(uVar94 * 5) << 2);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar300._4_4_ = auVar211._0_4_;
  auVar300._0_4_ = auVar211._0_4_;
  auVar300._8_4_ = auVar211._0_4_;
  auVar300._12_4_ = auVar211._0_4_;
  auVar128 = vshufps_avx(auVar211,auVar211,0x55);
  auVar102 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar99 = auVar102._0_4_;
  auVar269._0_4_ = fVar99 * auVar279._0_4_;
  fVar126 = auVar102._4_4_;
  auVar269._4_4_ = fVar126 * auVar279._4_4_;
  fVar260 = auVar102._8_4_;
  auVar269._8_4_ = fVar260 * auVar279._8_4_;
  fVar229 = auVar102._12_4_;
  auVar269._12_4_ = fVar229 * auVar279._12_4_;
  auVar266._0_4_ = auVar248._0_4_ * fVar99;
  auVar266._4_4_ = auVar248._4_4_ * fVar126;
  auVar266._8_4_ = auVar248._8_4_ * fVar260;
  auVar266._12_4_ = auVar248._12_4_ * fVar229;
  auVar246._0_4_ = auVar158._0_4_ * fVar99;
  auVar246._4_4_ = auVar158._4_4_ * fVar126;
  auVar246._8_4_ = auVar158._8_4_ * fVar260;
  auVar246._12_4_ = auVar158._12_4_ * fVar229;
  auVar102 = vfmadd231ps_fma(auVar269,auVar128,auVar110);
  auVar129 = vfmadd231ps_fma(auVar266,auVar128,auVar232);
  auVar128 = vfmadd231ps_fma(auVar246,auVar103,auVar128);
  auVar180 = vfmadd231ps_fma(auVar102,auVar300,auVar5);
  auVar129 = vfmadd231ps_fma(auVar129,auVar300,auVar306);
  auVar201 = vfmadd231ps_fma(auVar128,auVar104,auVar300);
  auVar301._4_4_ = auVar101._0_4_;
  auVar301._0_4_ = auVar101._0_4_;
  auVar301._8_4_ = auVar101._0_4_;
  auVar301._12_4_ = auVar101._0_4_;
  auVar128 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar99 = auVar102._0_4_;
  auVar212._0_4_ = fVar99 * auVar279._0_4_;
  fVar126 = auVar102._4_4_;
  auVar212._4_4_ = fVar126 * auVar279._4_4_;
  fVar260 = auVar102._8_4_;
  auVar212._8_4_ = fVar260 * auVar279._8_4_;
  fVar229 = auVar102._12_4_;
  auVar212._12_4_ = fVar229 * auVar279._12_4_;
  auVar127._0_4_ = auVar248._0_4_ * fVar99;
  auVar127._4_4_ = auVar248._4_4_ * fVar126;
  auVar127._8_4_ = auVar248._8_4_ * fVar260;
  auVar127._12_4_ = auVar248._12_4_ * fVar229;
  auVar102._0_4_ = auVar158._0_4_ * fVar99;
  auVar102._4_4_ = auVar158._4_4_ * fVar126;
  auVar102._8_4_ = auVar158._8_4_ * fVar260;
  auVar102._12_4_ = auVar158._12_4_ * fVar229;
  auVar110 = vfmadd231ps_fma(auVar212,auVar128,auVar110);
  auVar279 = vfmadd231ps_fma(auVar127,auVar128,auVar232);
  auVar232 = vfmadd231ps_fma(auVar102,auVar128,auVar103);
  auVar248 = vfmadd231ps_fma(auVar110,auVar301,auVar5);
  auVar103 = vfmadd231ps_fma(auVar279,auVar301,auVar306);
  auVar158 = vfmadd231ps_fma(auVar232,auVar301,auVar104);
  local_a70._8_4_ = 0x7fffffff;
  local_a70._0_8_ = 0x7fffffff7fffffff;
  local_a70._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar180,local_a70);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar110 = vblendvps_avx(auVar180,auVar200,auVar5);
  auVar5 = vandps_avx(auVar129,local_a70);
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar279 = vblendvps_avx(auVar129,auVar200,auVar5);
  auVar5 = vandps_avx(auVar201,local_a70);
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar5 = vblendvps_avx(auVar201,auVar200,auVar5);
  auVar306 = vrcpps_avx(auVar110);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = &DAT_3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar110 = vfnmadd213ps_fma(auVar110,auVar306,auVar230);
  auVar306 = vfmadd132ps_fma(auVar110,auVar306,auVar306);
  auVar110 = vrcpps_avx(auVar279);
  auVar279 = vfnmadd213ps_fma(auVar279,auVar110,auVar230);
  auVar232 = vfmadd132ps_fma(auVar279,auVar110,auVar110);
  auVar110 = vrcpps_avx(auVar5);
  auVar279 = vfnmadd213ps_fma(auVar5,auVar110,auVar230);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar104 = vfmadd132ps_fma(auVar279,auVar110,auVar110);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar248);
  auVar201._0_4_ = auVar306._0_4_ * auVar5._0_4_;
  auVar201._4_4_ = auVar306._4_4_ * auVar5._4_4_;
  auVar201._8_4_ = auVar306._8_4_ * auVar5._8_4_;
  auVar201._12_4_ = auVar306._12_4_ * auVar5._12_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar110);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar248);
  auVar213._0_4_ = auVar306._0_4_ * auVar5._0_4_;
  auVar213._4_4_ = auVar306._4_4_ * auVar5._4_4_;
  auVar213._8_4_ = auVar306._8_4_ * auVar5._8_4_;
  auVar213._12_4_ = auVar306._12_4_ * auVar5._12_4_;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar2;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar110 = vpmovsxwd_avx(auVar279);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar94 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar306);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar103);
  auVar247._0_4_ = auVar5._0_4_ * auVar232._0_4_;
  auVar247._4_4_ = auVar5._4_4_ * auVar232._4_4_;
  auVar247._8_4_ = auVar5._8_4_ * auVar232._8_4_;
  auVar247._12_4_ = auVar5._12_4_ * auVar232._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar110);
  auVar5 = vsubps_avx(auVar5,auVar103);
  auVar128._0_4_ = auVar232._0_4_ * auVar5._0_4_;
  auVar128._4_4_ = auVar232._4_4_ * auVar5._4_4_;
  auVar128._8_4_ = auVar232._8_4_ * auVar5._8_4_;
  auVar128._12_4_ = auVar232._12_4_ * auVar5._12_4_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar97 + uVar94 + 6);
  auVar5 = vpmovsxwd_avx(auVar232);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar158);
  auVar180._0_4_ = auVar104._0_4_ * auVar5._0_4_;
  auVar180._4_4_ = auVar104._4_4_ * auVar5._4_4_;
  auVar180._8_4_ = auVar104._8_4_ * auVar5._8_4_;
  auVar180._12_4_ = auVar104._12_4_ * auVar5._12_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar248);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar158);
  auVar103._0_4_ = auVar104._0_4_ * auVar5._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar5._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar5._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar201,auVar213);
  auVar110 = vpminsd_avx(auVar247,auVar128);
  auVar5 = vmaxps_avx(auVar5,auVar110);
  auVar110 = vpminsd_avx(auVar180,auVar103);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar261._4_4_ = uVar96;
  auVar261._0_4_ = uVar96;
  auVar261._8_4_ = uVar96;
  auVar261._12_4_ = uVar96;
  auVar110 = vmaxps_avx(auVar110,auVar261);
  auVar5 = vmaxps_avx(auVar5,auVar110);
  local_4b0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar201,auVar213);
  auVar110 = vpmaxsd_avx(auVar247,auVar128);
  auVar5 = vminps_avx(auVar5,auVar110);
  auVar110 = vpmaxsd_avx(auVar180,auVar103);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar158._4_4_ = uVar96;
  auVar158._0_4_ = uVar96;
  auVar158._8_4_ = uVar96;
  auVar158._12_4_ = uVar96;
  auVar110 = vminps_avx(auVar110,auVar158);
  auVar5 = vminps_avx(auVar5,auVar110);
  auVar104._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar129[4] = PVar2;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar2;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar2;
  auVar129._13_3_ = 0;
  auVar110 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar5 = vcmpps_avx(local_4b0,auVar104,2);
  auVar5 = vandps_avx(auVar5,auVar110);
  uVar91 = vmovmskps_avx(auVar5);
  local_bb1 = uVar91 != 0;
  if (uVar91 == 0) {
    return local_bb1;
  }
  uVar91 = uVar91 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_220 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  local_9b8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_840 = 0x7fffffff;
  uStack_83c = 0x7fffffff;
  uStack_838 = 0x7fffffff;
  uStack_834 = 0x7fffffff;
  uStack_830 = 0x7fffffff;
  uStack_82c = 0x7fffffff;
  uStack_828 = 0x7fffffff;
  uStack_824 = 0x7fffffff;
  local_720 = 0x80000000;
  uStack_71c = 0x80000000;
  uStack_718 = 0x80000000;
  uStack_714 = 0x80000000;
  fStack_710 = -0.0;
  fStack_70c = -0.0;
  fStack_708 = -0.0;
  uStack_704 = 0x80000000;
  local_8b0 = prim;
LAB_016ba5fe:
  lVar95 = 0;
  local_8a8 = (ulong)uVar91;
  for (uVar97 = local_8a8; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar95 = lVar95 + 1;
  }
  local_6d0 = *(uint *)(local_8b0 + 2);
  local_af0 = (ulong)local_6d0;
  local_6e0 = *(uint *)(local_8b0 + lVar95 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[local_af0].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_6e0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar95 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar95 + (long)p_Var4 * uVar97);
  auVar110 = *(undefined1 (*) [16])(lVar95 + (uVar97 + 1) * (long)p_Var4);
  local_8a8 = local_8a8 - 1 & local_8a8;
  if (local_8a8 != 0) {
    uVar98 = local_8a8 - 1 & local_8a8;
    for (uVar94 = local_8a8; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    }
    if (uVar98 != 0) {
      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar279 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar306 = vinsertps_avx(auVar279,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar267._4_4_ = uVar96;
  auVar267._0_4_ = uVar96;
  auVar267._8_4_ = uVar96;
  auVar267._12_4_ = uVar96;
  fStack_9f0 = (float)uVar96;
  _local_a00 = auVar267;
  fStack_9ec = (float)uVar96;
  fStack_9e8 = (float)uVar96;
  register0x0000149c = uVar96;
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar270._4_4_ = uVar96;
  auVar270._0_4_ = uVar96;
  auVar270._8_4_ = uVar96;
  auVar270._12_4_ = uVar96;
  fStack_810 = (float)uVar96;
  _local_820 = auVar270;
  fStack_80c = (float)uVar96;
  fStack_808 = (float)uVar96;
  register0x000014dc = uVar96;
  auVar272 = ZEXT3264(_local_820);
  auVar279 = vunpcklps_avx(auVar267,auVar270);
  fVar99 = *(float *)(ray + k * 4 + 0x60);
  auVar278._4_4_ = fVar99;
  auVar278._0_4_ = fVar99;
  auVar278._8_4_ = fVar99;
  auVar278._12_4_ = fVar99;
  fStack_950 = fVar99;
  _local_960 = auVar278;
  fStack_94c = fVar99;
  fStack_948 = fVar99;
  register0x0000151c = fVar99;
  auVar287 = ZEXT3264(_local_960);
  local_910 = vinsertps_avx(auVar279,auVar278,0x28);
  auVar256 = ZEXT1664(local_910);
  auVar214._0_4_ = (auVar5._0_4_ + auVar110._0_4_) * 0.5;
  auVar214._4_4_ = (auVar5._4_4_ + auVar110._4_4_) * 0.5;
  auVar214._8_4_ = (auVar5._8_4_ + auVar110._8_4_) * 0.5;
  auVar214._12_4_ = (auVar5._12_4_ + auVar110._12_4_) * 0.5;
  auVar279 = vsubps_avx(auVar214,auVar306);
  auVar279 = vdpps_avx(auVar279,local_910,0x7f);
  local_920 = vdpps_avx(local_910,local_910,0x7f);
  auVar293 = ZEXT1664(local_920);
  auVar232 = vrcpss_avx(local_920,local_920);
  auVar248 = vfnmadd213ss_fma(auVar232,local_920,ZEXT416(0x40000000));
  fVar126 = auVar279._0_4_ * auVar232._0_4_ * auVar248._0_4_;
  auVar225._4_4_ = fVar126;
  auVar225._0_4_ = fVar126;
  auVar225._8_4_ = fVar126;
  auVar225._12_4_ = fVar126;
  auVar279 = vfmadd231ps_fma(auVar306,local_910,auVar225);
  auVar279 = vblendps_avx(auVar279,_DAT_01feba10,8);
  local_a30 = vsubps_avx(auVar5,auVar279);
  local_a40 = vsubps_avx(*(undefined1 (*) [16])(lVar95 + (uVar97 + 2) * (long)p_Var4),auVar279);
  local_a50 = vsubps_avx(auVar110,auVar279);
  _local_a60 = vsubps_avx(*(undefined1 (*) [16])(lVar95 + (uVar97 + 3) * (long)p_Var4),auVar279);
  auVar5 = vmovshdup_avx(local_a30);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vshufps_avx(local_a30,local_a30,0xaa);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar5 = vshufps_avx(local_a30,local_a30,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(local_a50);
  local_320 = auVar5._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar5 = vshufps_avx(local_a50,local_a50,0xaa);
  local_340 = auVar5._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar5 = vshufps_avx(local_a50,local_a50,0xff);
  local_360 = auVar5._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar5 = vmovshdup_avx(local_a40);
  local_380 = auVar5._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar5 = vshufps_avx(local_a40,local_a40,0xaa);
  local_3a0 = auVar5._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar5 = vshufps_avx(local_a40,local_a40,0xff);
  local_3c0 = auVar5._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar5 = vmovshdup_avx(_local_a60);
  local_3e0 = auVar5._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar5 = vshufps_avx(_local_a60,_local_a60,0xaa);
  local_400 = auVar5._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar5 = vshufps_avx(_local_a60,_local_a60,0xff);
  local_420 = auVar5._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar99 * fVar99)),_local_820,_local_820);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_a00,_local_a00);
  uVar96 = auVar5._0_4_;
  local_200._4_4_ = uVar96;
  local_200._0_4_ = uVar96;
  local_200._8_4_ = uVar96;
  local_200._12_4_ = uVar96;
  local_200._16_4_ = uVar96;
  local_200._20_4_ = uVar96;
  local_200._24_4_ = uVar96;
  local_200._28_4_ = uVar96;
  fVar99 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)fVar126);
  local_260 = fVar99 - fVar126;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar97 = 1;
  uVar98 = 0;
  local_440 = local_a30._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_460 = local_a50._0_4_;
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  local_480 = local_a40._0_4_;
  uStack_47c = local_480;
  uStack_478 = local_480;
  uStack_474 = local_480;
  uStack_470 = local_480;
  uStack_46c = local_480;
  uStack_468 = local_480;
  uStack_464 = local_480;
  local_240 = local_a60._0_4_;
  auVar217._4_4_ = uStack_83c;
  auVar217._0_4_ = local_840;
  auVar217._8_4_ = uStack_838;
  auVar217._12_4_ = uStack_834;
  auVar217._16_4_ = uStack_830;
  auVar217._20_4_ = uStack_82c;
  auVar217._24_4_ = uStack_828;
  auVar217._28_4_ = uStack_824;
  local_4a0 = vandps_avx(local_200,auVar217);
  auVar5 = vsqrtss_avx(local_920,local_920);
  local_ae4 = auVar5._0_4_;
  auVar5 = vsqrtss_avx(local_920,local_920);
  local_ae8 = auVar5._0_4_;
  local_8c0 = ZEXT816(0x3f80000000000000);
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  uVar94 = 0;
  fVar260 = 0.0;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6cc = local_6d0;
  uStack_6c8 = local_6d0;
  uStack_6c4 = local_6d0;
  do {
    auVar5 = vmovshdup_avx(local_8c0);
    fVar238 = local_8c0._0_4_;
    fVar229 = auVar5._0_4_ - fVar238;
    fVar100 = fVar229 * 0.04761905;
    local_980._4_4_ = fVar238;
    local_980._0_4_ = fVar238;
    local_980._8_4_ = fVar238;
    local_980._12_4_ = fVar238;
    local_980._16_4_ = fVar238;
    local_980._20_4_ = fVar238;
    local_980._24_4_ = fVar238;
    local_980._28_4_ = fVar238;
    local_760._4_4_ = fVar229;
    local_760._0_4_ = fVar229;
    local_760._8_4_ = fVar229;
    local_760._12_4_ = fVar229;
    local_760._16_4_ = fVar229;
    local_760._20_4_ = fVar229;
    local_760._24_4_ = fVar229;
    local_760._28_4_ = fVar229;
    auVar5 = vfmadd231ps_fma(local_980,local_760,_DAT_02020f20);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar115,ZEXT1632(auVar5));
    fVar208 = auVar5._0_4_;
    fVar209 = auVar5._4_4_;
    fVar227 = auVar5._8_4_;
    fVar228 = auVar5._12_4_;
    fVar229 = auVar121._0_4_;
    fVar238 = auVar121._4_4_;
    fVar239 = auVar121._8_4_;
    fVar240 = auVar121._12_4_;
    fVar241 = auVar121._16_4_;
    fVar242 = auVar121._20_4_;
    fVar244 = auVar121._24_4_;
    fVar245 = fVar208 * 3.0;
    fVar257 = fVar209 * 3.0;
    fVar258 = fVar227 * 3.0;
    fVar259 = fVar228 * 3.0;
    auVar179._0_4_ = fVar229 * fVar229;
    auVar179._4_4_ = fVar238 * fVar238;
    auVar179._8_4_ = fVar239 * fVar239;
    auVar179._12_4_ = fVar240 * fVar240;
    auVar179._16_4_ = fVar241 * fVar241;
    auVar179._20_4_ = fVar242 * fVar242;
    auVar179._28_36_ = auVar272._28_36_;
    auVar179._24_4_ = fVar244 * fVar244;
    fVar243 = auVar121._28_4_;
    auVar272._0_4_ = (auVar179._0_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._4_4_ = (auVar179._4_4_ * (fVar238 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._8_4_ = (auVar179._8_4_ * (fVar239 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._12_4_ = (auVar179._12_4_ * (fVar240 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._16_4_ = (auVar179._16_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._20_4_ = (auVar179._20_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar272._28_36_ = auVar293._28_36_;
    auVar272._24_4_ = (auVar179._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar121 = auVar272._0_32_;
    fVar210 = fVar208 * fVar208 * (float)((uint)fVar229 ^ local_720) * 0.5;
    fVar219 = fVar209 * fVar209 * (float)((uint)fVar238 ^ uStack_71c) * 0.5;
    fVar220 = fVar227 * fVar227 * (float)((uint)fVar239 ^ uStack_718) * 0.5;
    fVar221 = fVar228 * fVar228 * (float)((uint)fVar240 ^ uStack_714) * 0.5;
    fVar222 = (float)((uint)fVar241 ^ (uint)fStack_710) * 0.0 * 0.0 * 0.5;
    fVar223 = (float)((uint)fVar242 ^ (uint)fStack_70c) * 0.0 * 0.0 * 0.5;
    fVar224 = (float)((uint)fVar244 ^ (uint)fStack_708) * 0.0 * 0.0 * 0.5;
    auVar6._4_4_ = fStack_23c * fVar219;
    auVar6._0_4_ = local_240 * fVar210;
    auVar6._8_4_ = fStack_238 * fVar220;
    auVar6._12_4_ = fStack_234 * fVar221;
    auVar6._16_4_ = fStack_230 * fVar222;
    auVar6._20_4_ = fStack_22c * fVar223;
    auVar6._24_4_ = fStack_228 * fVar224;
    auVar6._28_4_ = (uint)fVar243 ^ uStack_704;
    auVar169._4_4_ = fVar219 * local_3e0._4_4_;
    auVar169._0_4_ = fVar210 * (float)local_3e0;
    auVar169._8_4_ = fVar220 * (float)uStack_3d8;
    auVar169._12_4_ = fVar221 * uStack_3d8._4_4_;
    auVar169._16_4_ = fVar222 * (float)uStack_3d0;
    auVar169._20_4_ = fVar223 * uStack_3d0._4_4_;
    auVar169._24_4_ = fVar224 * (float)uStack_3c8;
    auVar169._28_4_ = uStack_704;
    auVar118._4_4_ = fVar219 * local_400._4_4_;
    auVar118._0_4_ = fVar210 * (float)local_400;
    auVar118._8_4_ = fVar220 * (float)uStack_3f8;
    auVar118._12_4_ = fVar221 * uStack_3f8._4_4_;
    auVar118._16_4_ = fVar222 * (float)uStack_3f0;
    auVar118._20_4_ = fVar223 * uStack_3f0._4_4_;
    auVar118._24_4_ = fVar224 * (float)uStack_3e8;
    auVar118._28_4_ = 0x40000000;
    auVar8._4_4_ = fVar219 * local_420._4_4_;
    auVar8._0_4_ = fVar210 * (float)local_420;
    auVar8._8_4_ = fVar220 * (float)uStack_418;
    auVar8._12_4_ = fVar221 * uStack_418._4_4_;
    auVar8._16_4_ = fVar222 * (float)uStack_410;
    auVar8._20_4_ = fVar223 * uStack_410._4_4_;
    auVar8._24_4_ = fVar224 * (float)uStack_408;
    auVar8._28_4_ = fVar260;
    auVar67._4_4_ = uStack_47c;
    auVar67._0_4_ = local_480;
    auVar67._8_4_ = uStack_478;
    auVar67._12_4_ = uStack_474;
    auVar67._16_4_ = uStack_470;
    auVar67._20_4_ = uStack_46c;
    auVar67._24_4_ = uStack_468;
    auVar67._28_4_ = uStack_464;
    auVar5 = vfmadd231ps_fma(auVar6,auVar121,auVar67);
    auVar77._8_8_ = uStack_378;
    auVar77._0_8_ = local_380;
    auVar77._16_8_ = uStack_370;
    auVar77._24_8_ = uStack_368;
    auVar110 = vfmadd231ps_fma(auVar169,auVar121,auVar77);
    auVar75._8_8_ = uStack_398;
    auVar75._0_8_ = local_3a0;
    auVar75._16_8_ = uStack_390;
    auVar75._24_8_ = uStack_388;
    auVar279 = vfmadd231ps_fma(auVar118,auVar121,auVar75);
    auVar73._8_8_ = uStack_3b8;
    auVar73._0_8_ = local_3c0;
    auVar73._16_8_ = uStack_3b0;
    auVar73._24_8_ = uStack_3a8;
    auVar306 = vfmadd231ps_fma(auVar8,auVar121,auVar73);
    auVar9._4_4_ = fVar238 * fVar238 * (float)((uint)fVar209 ^ uStack_71c) * 0.5;
    auVar9._0_4_ = fVar229 * fVar229 * (float)((uint)fVar208 ^ local_720) * 0.5;
    auVar9._8_4_ = fVar239 * fVar239 * (float)((uint)fVar227 ^ uStack_718) * 0.5;
    auVar9._12_4_ = fVar240 * fVar240 * (float)((uint)fVar228 ^ uStack_714) * 0.5;
    auVar9._16_4_ = fVar241 * fVar241 * fStack_710 * 0.5;
    auVar9._20_4_ = fVar242 * fVar242 * fStack_70c * 0.5;
    auVar9._24_4_ = fVar244 * fVar244 * fStack_708 * 0.5;
    auVar9._28_4_ = auVar287._28_4_;
    auVar147._4_4_ = ((fVar257 + -5.0) * fVar209 * fVar209 + 2.0) * 0.5;
    auVar147._0_4_ = ((fVar245 + -5.0) * fVar208 * fVar208 + 2.0) * 0.5;
    auVar147._8_4_ = ((fVar258 + -5.0) * fVar227 * fVar227 + 2.0) * 0.5;
    auVar147._12_4_ = ((fVar259 + -5.0) * fVar228 * fVar228 + 2.0) * 0.5;
    auVar147._16_4_ = 0x3f800000;
    auVar147._20_4_ = 0x3f800000;
    auVar147._24_4_ = 0x3f800000;
    auVar147._28_4_ = auVar293._28_4_ + 2.0;
    auVar69._4_4_ = uStack_45c;
    auVar69._0_4_ = local_460;
    auVar69._8_4_ = uStack_458;
    auVar69._12_4_ = uStack_454;
    auVar69._16_4_ = uStack_450;
    auVar69._20_4_ = uStack_44c;
    auVar69._24_4_ = uStack_448;
    auVar69._28_4_ = uStack_444;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar147,auVar69);
    auVar83._8_8_ = uStack_318;
    auVar83._0_8_ = local_320;
    auVar83._16_8_ = uStack_310;
    auVar83._24_8_ = uStack_308;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar147,auVar83);
    auVar81._8_8_ = uStack_338;
    auVar81._0_8_ = local_340;
    auVar81._16_8_ = uStack_330;
    auVar81._24_8_ = uStack_328;
    auVar279 = vfmadd231ps_fma(ZEXT1632(auVar279),auVar147,auVar81);
    auVar79._8_8_ = uStack_358;
    auVar79._0_8_ = local_360;
    auVar79._16_8_ = uStack_350;
    auVar79._24_8_ = uStack_348;
    auVar306 = vfmadd231ps_fma(ZEXT1632(auVar306),auVar147,auVar79);
    auVar71._4_4_ = uStack_43c;
    auVar71._0_4_ = local_440;
    auVar71._8_4_ = uStack_438;
    auVar71._12_4_ = uStack_434;
    auVar71._16_4_ = uStack_430;
    auVar71._20_4_ = uStack_42c;
    auVar71._24_4_ = uStack_428;
    auVar71._28_4_ = uStack_424;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar9,auVar71);
    auVar88._8_8_ = uStack_198;
    auVar88._0_8_ = local_1a0;
    auVar88._16_8_ = uStack_190;
    auVar88._24_8_ = uStack_188;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar9,auVar88);
    auVar169 = ZEXT1632(auVar110);
    auVar87._8_8_ = uStack_1b8;
    auVar87._0_8_ = local_1c0;
    auVar87._16_8_ = uStack_1b0;
    auVar87._24_8_ = uStack_1a8;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar279),auVar9,auVar87);
    auVar86._8_8_ = uStack_1d8;
    auVar86._0_8_ = local_1e0;
    auVar86._16_8_ = uStack_1d0;
    auVar86._24_8_ = uStack_1c8;
    auVar279 = vfmadd231ps_fma(ZEXT1632(auVar306),auVar86,auVar9);
    auVar235._4_4_ = (fVar238 + fVar238) * fVar209;
    auVar235._0_4_ = (fVar229 + fVar229) * fVar208;
    auVar235._8_4_ = (fVar239 + fVar239) * fVar227;
    auVar235._12_4_ = (fVar240 + fVar240) * fVar228;
    auVar235._16_4_ = (fVar241 + fVar241) * 0.0;
    auVar235._20_4_ = (fVar242 + fVar242) * 0.0;
    auVar235._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar235._28_4_ = 0;
    auVar121 = vsubps_avx(auVar235,auVar179._0_32_);
    fVar260 = auVar256._28_4_ + 2.0;
    auVar10._4_4_ = (fVar238 + fVar238) * (fVar257 + 2.0);
    auVar10._0_4_ = (fVar229 + fVar229) * (fVar245 + 2.0);
    auVar10._8_4_ = (fVar239 + fVar239) * (fVar258 + 2.0);
    auVar10._12_4_ = (fVar240 + fVar240) * (fVar259 + 2.0);
    auVar10._16_4_ = (fVar241 + fVar241) * 2.0;
    auVar10._20_4_ = (fVar242 + fVar242) * 2.0;
    auVar10._24_4_ = (fVar244 + fVar244) * 2.0;
    auVar10._28_4_ = fVar260;
    auVar11._4_4_ = fVar238 * fVar238 * 3.0;
    auVar11._0_4_ = fVar229 * fVar229 * 3.0;
    auVar11._8_4_ = fVar239 * fVar239 * 3.0;
    auVar11._12_4_ = fVar240 * fVar240 * 3.0;
    auVar11._16_4_ = fVar241 * fVar241 * 3.0;
    auVar11._20_4_ = fVar242 * fVar242 * 3.0;
    auVar11._24_4_ = fVar244 * fVar244 * 3.0;
    auVar11._28_4_ = fVar243;
    auVar217 = vsubps_avx(auVar10,auVar11);
    auVar7 = vsubps_avx(ZEXT1632(CONCAT412(fVar228 * fVar228,
                                           CONCAT48(fVar227 * fVar227,
                                                    CONCAT44(fVar209 * fVar209,fVar208 * fVar208))))
                        ,auVar235);
    auVar12._4_4_ = auVar121._4_4_ * 0.5;
    auVar12._0_4_ = auVar121._0_4_ * 0.5;
    auVar12._8_4_ = auVar121._8_4_ * 0.5;
    auVar12._12_4_ = auVar121._12_4_ * 0.5;
    auVar12._16_4_ = auVar121._16_4_ * 0.5;
    auVar12._20_4_ = auVar121._20_4_ * 0.5;
    auVar12._24_4_ = auVar121._24_4_ * 0.5;
    auVar12._28_4_ = fVar260;
    auVar14._28_4_ = auVar256._28_4_ + -5.0 + 0.0;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(((fVar228 + fVar228) * (fVar259 + -5.0) + fVar259 * fVar228) * 0.5,
                            CONCAT48(((fVar227 + fVar227) * (fVar258 + -5.0) + fVar258 * fVar227) *
                                     0.5,CONCAT44(((fVar209 + fVar209) * (fVar257 + -5.0) +
                                                  fVar257 * fVar209) * 0.5,
                                                  ((fVar208 + fVar208) * (fVar245 + -5.0) +
                                                  fVar245 * fVar208) * 0.5))));
    auVar142._4_4_ = auVar217._4_4_ * 0.5;
    auVar142._0_4_ = auVar217._0_4_ * 0.5;
    auVar142._8_4_ = auVar217._8_4_ * 0.5;
    auVar142._12_4_ = auVar217._12_4_ * 0.5;
    auVar142._16_4_ = auVar217._16_4_ * 0.5;
    auVar142._20_4_ = auVar217._20_4_ * 0.5;
    fVar260 = auVar217._28_4_;
    auVar142._24_4_ = auVar217._24_4_ * 0.5;
    auVar142._28_4_ = fVar260;
    fVar229 = auVar7._0_4_ * 0.5;
    fVar238 = auVar7._4_4_ * 0.5;
    fVar239 = auVar7._8_4_ * 0.5;
    fVar240 = auVar7._12_4_ * 0.5;
    fVar241 = auVar7._16_4_ * 0.5;
    fVar242 = auVar7._20_4_ * 0.5;
    fVar244 = auVar7._24_4_ * 0.5;
    auVar264._4_4_ = fStack_23c * fVar238;
    auVar264._0_4_ = local_240 * fVar229;
    auVar264._8_4_ = fStack_238 * fVar239;
    auVar264._12_4_ = fStack_234 * fVar240;
    auVar264._16_4_ = fStack_230 * fVar241;
    auVar264._20_4_ = fStack_22c * fVar242;
    auVar264._24_4_ = fStack_228 * fVar244;
    auVar264._28_4_ = fStack_224;
    auVar268._4_4_ = fVar238 * local_3e0._4_4_;
    auVar268._0_4_ = fVar229 * (float)local_3e0;
    auVar268._8_4_ = fVar239 * (float)uStack_3d8;
    auVar268._12_4_ = fVar240 * uStack_3d8._4_4_;
    auVar268._16_4_ = fVar241 * (float)uStack_3d0;
    auVar268._20_4_ = fVar242 * uStack_3d0._4_4_;
    auVar268._24_4_ = fVar244 * (float)uStack_3c8;
    auVar268._28_4_ = 0x40000000;
    auVar236._4_4_ = fVar238 * local_400._4_4_;
    auVar236._0_4_ = fVar229 * (float)local_400;
    auVar236._8_4_ = fVar239 * (float)uStack_3f8;
    auVar236._12_4_ = fVar240 * uStack_3f8._4_4_;
    auVar236._16_4_ = fVar241 * (float)uStack_3f0;
    auVar236._20_4_ = fVar242 * uStack_3f0._4_4_;
    auVar236._24_4_ = fVar244 * (float)uStack_3e8;
    auVar236._28_4_ = auVar121._28_4_;
    auVar303._4_4_ = fVar238 * local_420._4_4_;
    auVar303._0_4_ = fVar229 * (float)local_420;
    auVar303._8_4_ = fVar239 * (float)uStack_418;
    auVar303._12_4_ = fVar240 * uStack_418._4_4_;
    auVar303._16_4_ = fVar241 * (float)uStack_410;
    auVar303._20_4_ = fVar242 * uStack_410._4_4_;
    auVar303._24_4_ = fVar244 * (float)uStack_408;
    auVar303._28_4_ = auVar7._28_4_;
    auVar68._4_4_ = uStack_47c;
    auVar68._0_4_ = local_480;
    auVar68._8_4_ = uStack_478;
    auVar68._12_4_ = uStack_474;
    auVar68._16_4_ = uStack_470;
    auVar68._20_4_ = uStack_46c;
    auVar68._24_4_ = uStack_468;
    auVar68._28_4_ = uStack_464;
    auVar306 = vfmadd231ps_fma(auVar264,auVar142,auVar68);
    auVar78._8_8_ = uStack_378;
    auVar78._0_8_ = local_380;
    auVar78._16_8_ = uStack_370;
    auVar78._24_8_ = uStack_368;
    auVar232 = vfmadd231ps_fma(auVar268,auVar142,auVar78);
    auVar76._8_8_ = uStack_398;
    auVar76._0_8_ = local_3a0;
    auVar76._16_8_ = uStack_390;
    auVar76._24_8_ = uStack_388;
    auVar248 = vfmadd231ps_fma(auVar236,auVar142,auVar76);
    auVar74._8_8_ = uStack_3b8;
    auVar74._0_8_ = local_3c0;
    auVar74._16_8_ = uStack_3b0;
    auVar74._24_8_ = uStack_3a8;
    auVar104 = vfmadd231ps_fma(auVar303,auVar142,auVar74);
    auVar70._4_4_ = uStack_45c;
    auVar70._0_4_ = local_460;
    auVar70._8_4_ = uStack_458;
    auVar70._12_4_ = uStack_454;
    auVar70._16_4_ = uStack_450;
    auVar70._20_4_ = uStack_44c;
    auVar70._24_4_ = uStack_448;
    auVar70._28_4_ = uStack_444;
    auVar306 = vfmadd231ps_fma(ZEXT1632(auVar306),auVar14,auVar70);
    auVar84._8_8_ = uStack_318;
    auVar84._0_8_ = local_320;
    auVar84._16_8_ = uStack_310;
    auVar84._24_8_ = uStack_308;
    auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar14,auVar84);
    auVar82._8_8_ = uStack_338;
    auVar82._0_8_ = local_340;
    auVar82._16_8_ = uStack_330;
    auVar82._24_8_ = uStack_328;
    auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar14,auVar82);
    auVar80._8_8_ = uStack_358;
    auVar80._0_8_ = local_360;
    auVar80._16_8_ = uStack_350;
    auVar80._24_8_ = uStack_348;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar14,auVar80);
    auVar72._4_4_ = uStack_43c;
    auVar72._0_4_ = local_440;
    auVar72._8_4_ = uStack_438;
    auVar72._12_4_ = uStack_434;
    auVar72._16_4_ = uStack_430;
    auVar72._20_4_ = uStack_42c;
    auVar72._24_4_ = uStack_428;
    auVar72._28_4_ = uStack_424;
    auVar306 = vfmadd231ps_fma(ZEXT1632(auVar306),auVar12,auVar72);
    auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),auVar12,auVar88);
    auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar12,auVar87);
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar86,auVar12);
    local_700._0_4_ = auVar306._0_4_ * fVar100;
    local_700._4_4_ = auVar306._4_4_ * fVar100;
    local_700._8_4_ = auVar306._8_4_ * fVar100;
    local_700._12_4_ = auVar306._12_4_ * fVar100;
    local_700._16_4_ = fVar100 * 0.0;
    local_700._20_4_ = fVar100 * 0.0;
    local_700._24_4_ = fVar100 * 0.0;
    local_700._28_4_ = 0;
    fVar229 = auVar232._0_4_ * fVar100;
    fVar238 = auVar232._4_4_ * fVar100;
    local_9e0._4_4_ = fVar238;
    local_9e0._0_4_ = fVar229;
    fVar241 = auVar232._8_4_ * fVar100;
    local_9e0._8_4_ = fVar241;
    fVar210 = auVar232._12_4_ * fVar100;
    local_9e0._12_4_ = fVar210;
    local_9e0._16_4_ = fVar100 * 0.0;
    local_9e0._20_4_ = fVar100 * 0.0;
    local_9e0._24_4_ = fVar100 * 0.0;
    local_9e0._28_4_ = fVar243 + fVar243;
    fVar305 = auVar248._0_4_ * fVar100;
    fVar307 = auVar248._4_4_ * fVar100;
    local_aa0._4_4_ = fVar307;
    local_aa0._0_4_ = fVar305;
    fVar308 = auVar248._8_4_ * fVar100;
    local_aa0._8_4_ = fVar308;
    fVar309 = auVar248._12_4_ * fVar100;
    local_aa0._12_4_ = fVar309;
    fVar310 = fVar100 * 0.0;
    local_aa0._16_4_ = fVar310;
    fVar311 = fVar100 * 0.0;
    local_aa0._20_4_ = fVar311;
    fVar312 = fVar100 * 0.0;
    local_aa0._24_4_ = fVar312;
    local_aa0._28_4_ = 0x3f000000;
    fVar239 = fVar100 * auVar104._0_4_;
    fVar240 = fVar100 * auVar104._4_4_;
    auVar16._4_4_ = fVar240;
    auVar16._0_4_ = fVar239;
    fVar242 = fVar100 * auVar104._8_4_;
    auVar16._8_4_ = fVar242;
    fVar244 = fVar100 * auVar104._12_4_;
    auVar16._12_4_ = fVar244;
    auVar16._16_4_ = fVar100 * 0.0;
    auVar16._20_4_ = fVar100 * 0.0;
    auVar16._24_4_ = fVar100 * 0.0;
    auVar16._28_4_ = fVar260;
    auVar142 = ZEXT1632(auVar5);
    local_940 = vpermps_avx2(_DAT_0205d4a0,auVar142);
    _local_900 = vpermps_avx2(_DAT_0205d4a0,auVar169);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar110));
    auVar8 = vsubps_avx(local_940,ZEXT1632(auVar5));
    auVar9 = vsubps_avx(local_a20,ZEXT1632(auVar110));
    auVar303 = ZEXT1632(auVar110);
    fVar219 = auVar9._0_4_;
    fVar223 = auVar9._4_4_;
    auVar17._4_4_ = fVar223 * local_700._4_4_;
    auVar17._0_4_ = fVar219 * local_700._0_4_;
    fVar224 = auVar9._8_4_;
    auVar17._8_4_ = fVar224 * local_700._8_4_;
    fVar208 = auVar9._12_4_;
    auVar17._12_4_ = fVar208 * local_700._12_4_;
    fVar209 = auVar9._16_4_;
    auVar17._16_4_ = fVar209 * local_700._16_4_;
    fVar227 = auVar9._20_4_;
    auVar17._20_4_ = fVar227 * local_700._20_4_;
    fVar228 = auVar9._24_4_;
    auVar17._24_4_ = fVar228 * local_700._24_4_;
    auVar17._28_4_ = local_a20._28_4_;
    auVar5 = vfmsub231ps_fma(auVar17,local_aa0,auVar8);
    auVar147 = vsubps_avx(_local_900,auVar169);
    fVar288 = auVar8._0_4_;
    fVar294 = auVar8._4_4_;
    auVar18._4_4_ = fVar294 * fVar238;
    auVar18._0_4_ = fVar288 * fVar229;
    fVar295 = auVar8._8_4_;
    auVar18._8_4_ = fVar295 * fVar241;
    fVar296 = auVar8._12_4_;
    auVar18._12_4_ = fVar296 * fVar210;
    fVar297 = auVar8._16_4_;
    auVar18._16_4_ = fVar297 * fVar100 * 0.0;
    fVar298 = auVar8._20_4_;
    auVar18._20_4_ = fVar298 * fVar100 * 0.0;
    fVar299 = auVar8._24_4_;
    auVar18._24_4_ = fVar299 * fVar100 * 0.0;
    auVar18._28_4_ = local_940._28_4_;
    auVar110 = vfmsub231ps_fma(auVar18,local_700,auVar147);
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                                CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                                         CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                                  auVar110._0_4_ * auVar110._0_4_)))
                                     ),ZEXT1632(auVar5),ZEXT1632(auVar5));
    fVar245 = auVar147._0_4_;
    fVar257 = auVar147._4_4_;
    auVar19._4_4_ = fVar257 * fVar307;
    auVar19._0_4_ = fVar245 * fVar305;
    fVar258 = auVar147._8_4_;
    auVar19._8_4_ = fVar258 * fVar308;
    fVar259 = auVar147._12_4_;
    auVar19._12_4_ = fVar259 * fVar309;
    fVar273 = auVar147._16_4_;
    auVar19._16_4_ = fVar273 * fVar310;
    fVar274 = auVar147._20_4_;
    auVar19._20_4_ = fVar274 * fVar311;
    fVar275 = auVar147._24_4_;
    auVar19._24_4_ = fVar275 * fVar312;
    auVar19._28_4_ = local_900._28_4_;
    auVar306 = vfmsub231ps_fma(auVar19,local_9e0,auVar9);
    auVar226._0_4_ = fVar219 * fVar219;
    auVar226._4_4_ = fVar223 * fVar223;
    auVar226._8_4_ = fVar224 * fVar224;
    auVar226._12_4_ = fVar208 * fVar208;
    auVar226._16_4_ = fVar209 * fVar209;
    auVar226._20_4_ = fVar227 * fVar227;
    auVar226._24_4_ = fVar228 * fVar228;
    auVar226._28_4_ = 0;
    auVar110 = vfmadd231ps_fma(auVar226,auVar147,auVar147);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar8,auVar8);
    auVar121 = vrcpps_avx(ZEXT1632(auVar110));
    auVar306 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar306),ZEXT1632(auVar306));
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = &DAT_3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar110),auVar116);
    auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar121,auVar121);
    local_ac0 = vpermps_avx2(_DAT_0205d4a0,local_700);
    local_740 = vpermps_avx2(_DAT_0205d4a0,local_aa0);
    auVar89._4_4_ = fVar223 * local_ac0._4_4_;
    auVar89._0_4_ = fVar219 * local_ac0._0_4_;
    auVar89._8_4_ = fVar224 * local_ac0._8_4_;
    auVar89._12_4_ = fVar208 * local_ac0._12_4_;
    auVar89._16_4_ = fVar209 * local_ac0._16_4_;
    auVar89._20_4_ = fVar227 * local_ac0._20_4_;
    auVar89._24_4_ = fVar228 * local_ac0._24_4_;
    auVar89._28_4_ = DAT_0205d4a0._28_4_;
    auVar232 = vfmsub231ps_fma(auVar89,local_740,auVar8);
    local_ae0 = vpermps_avx2(_DAT_0205d4a0,local_9e0);
    auVar20._4_4_ = fVar294 * local_ae0._4_4_;
    auVar20._0_4_ = fVar288 * local_ae0._0_4_;
    auVar20._8_4_ = fVar295 * local_ae0._8_4_;
    auVar20._12_4_ = fVar296 * local_ae0._12_4_;
    auVar20._16_4_ = fVar297 * local_ae0._16_4_;
    auVar20._20_4_ = fVar298 * local_ae0._20_4_;
    auVar20._24_4_ = fVar299 * local_ae0._24_4_;
    auVar20._28_4_ = 0;
    auVar248 = vfmsub231ps_fma(auVar20,local_ac0,auVar147);
    auVar232 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * auVar248._12_4_,
                                                  CONCAT48(auVar248._8_4_ * auVar248._8_4_,
                                                           CONCAT44(auVar248._4_4_ * auVar248._4_4_,
                                                                    auVar248._0_4_ * auVar248._0_4_)
                                                          ))),ZEXT1632(auVar232),ZEXT1632(auVar232))
    ;
    fVar229 = local_740._0_4_;
    auVar249._0_4_ = fVar245 * fVar229;
    fVar238 = local_740._4_4_;
    auVar249._4_4_ = fVar257 * fVar238;
    fVar241 = local_740._8_4_;
    auVar249._8_4_ = fVar258 * fVar241;
    fVar243 = local_740._12_4_;
    auVar249._12_4_ = fVar259 * fVar243;
    fVar220 = local_740._16_4_;
    auVar249._16_4_ = fVar273 * fVar220;
    fVar221 = local_740._20_4_;
    auVar249._20_4_ = fVar274 * fVar221;
    fVar222 = local_740._24_4_;
    auVar249._24_4_ = fVar275 * fVar222;
    auVar249._28_4_ = 0;
    auVar248 = vfmsub231ps_fma(auVar249,local_ae0,auVar9);
    auVar232 = vfmadd231ps_fma(ZEXT1632(auVar232),ZEXT1632(auVar248),ZEXT1632(auVar248));
    auVar121 = vmaxps_avx(ZEXT1632(CONCAT412(auVar306._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar306._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar306._4_4_ * auVar5._4_4_,
                                                               auVar306._0_4_ * auVar5._0_4_)))),
                          ZEXT1632(CONCAT412(auVar232._12_4_ * auVar5._12_4_,
                                             CONCAT48(auVar232._8_4_ * auVar5._8_4_,
                                                      CONCAT44(auVar232._4_4_ * auVar5._4_4_,
                                                               auVar232._0_4_ * auVar5._0_4_)))));
    auVar250._0_4_ = auVar279._0_4_ + fVar239;
    auVar250._4_4_ = auVar279._4_4_ + fVar240;
    auVar250._8_4_ = auVar279._8_4_ + fVar242;
    auVar250._12_4_ = auVar279._12_4_ + fVar244;
    auVar250._16_4_ = fVar100 * 0.0 + 0.0;
    auVar250._20_4_ = fVar100 * 0.0 + 0.0;
    auVar250._24_4_ = fVar100 * 0.0 + 0.0;
    auVar250._28_4_ = fVar260 + 0.0;
    auStack_790 = auVar250._16_16_;
    local_780 = ZEXT1632(auVar279);
    auVar217 = vsubps_avx(local_780,auVar16);
    local_7c0 = vpermps_avx2(_DAT_0205d4a0,auVar217);
    auVar14 = vpermps_avx2(_DAT_0205d4a0,local_780);
    auVar217 = vmaxps_avx(local_780,auVar250);
    auVar7 = vmaxps_avx(local_7c0,auVar14);
    auVar118 = vrsqrtps_avx(ZEXT1632(auVar110));
    auVar6 = vmaxps_avx(auVar217,auVar7);
    uVar96 = auVar217._28_4_;
    fVar260 = auVar118._0_4_;
    fVar100 = auVar118._4_4_;
    fVar239 = auVar118._8_4_;
    fVar240 = auVar118._12_4_;
    fVar242 = auVar118._16_4_;
    fVar244 = auVar118._20_4_;
    fVar210 = auVar118._24_4_;
    auVar262._0_4_ = fVar260 * fVar260 * fVar260 * auVar110._0_4_ * -0.5;
    auVar262._4_4_ = fVar100 * fVar100 * fVar100 * auVar110._4_4_ * -0.5;
    auVar262._8_4_ = fVar239 * fVar239 * fVar239 * auVar110._8_4_ * -0.5;
    auVar262._12_4_ = fVar240 * fVar240 * fVar240 * auVar110._12_4_ * -0.5;
    auVar262._16_4_ = fVar242 * fVar242 * fVar242 * -0.0;
    auVar262._20_4_ = fVar244 * fVar244 * fVar244 * -0.0;
    auVar262._24_4_ = fVar210 * fVar210 * fVar210 * -0.0;
    auVar262._28_4_ = 0;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar5 = vfmadd231ps_fma(auVar262,auVar117,auVar118);
    fVar100 = auVar5._0_4_;
    fVar239 = auVar5._4_4_;
    auVar21._4_4_ = fVar257 * fVar239;
    auVar21._0_4_ = fVar245 * fVar100;
    fVar242 = auVar5._8_4_;
    auVar21._8_4_ = fVar258 * fVar242;
    fVar210 = auVar5._12_4_;
    auVar21._12_4_ = fVar259 * fVar210;
    auVar21._16_4_ = fVar273 * 0.0;
    auVar21._20_4_ = fVar274 * 0.0;
    auVar21._24_4_ = fVar275 * 0.0;
    auVar21._28_4_ = uVar96;
    auVar22._4_4_ = (float)local_960._4_4_ * fVar223 * fVar239;
    auVar22._0_4_ = (float)local_960._0_4_ * fVar219 * fVar100;
    auVar22._8_4_ = fStack_958 * fVar224 * fVar242;
    auVar22._12_4_ = fStack_954 * fVar208 * fVar210;
    auVar22._16_4_ = fStack_950 * fVar209 * 0.0;
    auVar22._20_4_ = fStack_94c * fVar227 * 0.0;
    auVar22._24_4_ = fStack_948 * fVar228 * 0.0;
    auVar22._28_4_ = auVar9._28_4_;
    auVar5 = vfmadd231ps_fma(auVar22,auVar21,_local_820);
    auVar287 = ZEXT864(0) << 0x20;
    auVar217 = vsubps_avx(ZEXT832(0) << 0x20,auVar303);
    auVar272 = ZEXT3264(auVar217);
    fVar258 = auVar217._0_4_;
    auVar263._0_4_ = fVar258 * fVar219 * fVar100;
    fVar259 = auVar217._4_4_;
    auVar263._4_4_ = fVar259 * fVar223 * fVar239;
    fVar273 = auVar217._8_4_;
    auVar263._8_4_ = fVar273 * fVar224 * fVar242;
    fVar274 = auVar217._12_4_;
    auVar263._12_4_ = fVar274 * fVar208 * fVar210;
    fVar275 = auVar217._16_4_;
    auVar263._16_4_ = fVar275 * fVar209 * 0.0;
    fVar276 = auVar217._20_4_;
    auVar263._20_4_ = fVar276 * fVar227 * 0.0;
    fVar277 = auVar217._24_4_;
    auVar263._24_4_ = fVar277 * fVar228 * 0.0;
    auVar263._28_4_ = 0;
    auVar118 = vsubps_avx(ZEXT832(0) << 0x20,auVar169);
    auVar110 = vfmadd231ps_fma(auVar263,auVar118,auVar21);
    auVar23._4_4_ = fVar294 * fVar239;
    auVar23._0_4_ = fVar288 * fVar100;
    auVar23._8_4_ = fVar295 * fVar242;
    auVar23._12_4_ = fVar296 * fVar210;
    auVar23._16_4_ = fVar297 * 0.0;
    auVar23._20_4_ = fVar298 * 0.0;
    auVar23._24_4_ = fVar299 * 0.0;
    auVar23._28_4_ = uVar96;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar23,_local_a00);
    auVar236 = ZEXT832(0) << 0x20;
    auVar235 = vsubps_avx(auVar236,auVar142);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar235,auVar23);
    auVar24._4_4_ = fVar259 * (float)local_960._4_4_;
    auVar24._0_4_ = fVar258 * (float)local_960._0_4_;
    auVar24._8_4_ = fVar273 * fStack_958;
    auVar24._12_4_ = fVar274 * fStack_954;
    auVar24._16_4_ = fVar275 * fStack_950;
    auVar24._20_4_ = fVar276 * fStack_94c;
    auVar24._24_4_ = fVar277 * fStack_948;
    auVar24._28_4_ = uVar96;
    auVar279 = vfmadd231ps_fma(auVar24,_local_820,auVar118);
    auVar279 = vfmadd231ps_fma(ZEXT1632(auVar279),_local_a00,auVar235);
    fVar260 = auVar110._0_4_;
    fVar227 = auVar5._0_4_;
    fVar240 = auVar110._4_4_;
    fVar228 = auVar5._4_4_;
    fVar244 = auVar110._8_4_;
    fVar245 = auVar5._8_4_;
    fVar219 = auVar110._12_4_;
    fVar257 = auVar5._12_4_;
    auVar25._28_4_ = local_820._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar257 * fVar219,
                            CONCAT48(fVar245 * fVar244,CONCAT44(fVar228 * fVar240,fVar227 * fVar260)
                                    )));
    auVar10 = vsubps_avx(ZEXT1632(auVar279),auVar25);
    auVar26._4_4_ = fVar259 * fVar259;
    auVar26._0_4_ = fVar258 * fVar258;
    auVar26._8_4_ = fVar273 * fVar273;
    auVar26._12_4_ = fVar274 * fVar274;
    auVar26._16_4_ = fVar275 * fVar275;
    auVar26._20_4_ = fVar276 * fVar276;
    auVar26._24_4_ = fVar277 * fVar277;
    auVar26._28_4_ = local_820._28_4_;
    auVar279 = vfmadd231ps_fma(auVar26,auVar118,auVar118);
    auVar279 = vfmadd231ps_fma(ZEXT1632(auVar279),auVar235,auVar235);
    auVar7._28_4_ = auVar8._28_4_;
    auVar7._0_28_ =
         ZEXT1628(CONCAT412(fVar219 * fVar219,
                            CONCAT48(fVar244 * fVar244,CONCAT44(fVar240 * fVar240,fVar260 * fVar260)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar279),auVar7);
    auVar217 = vsqrtps_avx(auVar121);
    fVar209 = auVar217._28_4_ + auVar6._28_4_;
    fVar260 = (auVar217._0_4_ + auVar6._0_4_) * 1.0000002;
    fVar240 = (auVar217._4_4_ + auVar6._4_4_) * 1.0000002;
    fVar244 = (auVar217._8_4_ + auVar6._8_4_) * 1.0000002;
    fVar219 = (auVar217._12_4_ + auVar6._12_4_) * 1.0000002;
    fVar223 = (auVar217._16_4_ + auVar6._16_4_) * 1.0000002;
    fVar224 = (auVar217._20_4_ + auVar6._20_4_) * 1.0000002;
    fVar208 = (auVar217._24_4_ + auVar6._24_4_) * 1.0000002;
    auVar27._4_4_ = fVar240 * fVar240;
    auVar27._0_4_ = fVar260 * fVar260;
    auVar27._8_4_ = fVar244 * fVar244;
    auVar27._12_4_ = fVar219 * fVar219;
    auVar27._16_4_ = fVar223 * fVar223;
    auVar27._20_4_ = fVar224 * fVar224;
    auVar27._24_4_ = fVar208 * fVar208;
    auVar27._28_4_ = fVar209;
    auVar170._0_4_ = auVar10._0_4_ + auVar10._0_4_;
    auVar170._4_4_ = auVar10._4_4_ + auVar10._4_4_;
    auVar170._8_4_ = auVar10._8_4_ + auVar10._8_4_;
    auVar170._12_4_ = auVar10._12_4_ + auVar10._12_4_;
    auVar170._16_4_ = auVar10._16_4_ + auVar10._16_4_;
    auVar170._20_4_ = auVar10._20_4_ + auVar10._20_4_;
    auVar170._24_4_ = auVar10._24_4_ + auVar10._24_4_;
    fVar260 = auVar10._28_4_;
    auVar170._28_4_ = fVar260 + fVar260;
    auVar6 = vsubps_avx(auVar11,auVar27);
    auVar268 = ZEXT1632(auVar5);
    auVar28._28_4_ = DAT_0205d4a0._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar257 * fVar257,
                            CONCAT48(fVar245 * fVar245,CONCAT44(fVar228 * fVar228,fVar227 * fVar227)
                                    )));
    auVar10 = vsubps_avx(local_200,auVar28);
    auVar29._4_4_ = auVar170._4_4_ * auVar170._4_4_;
    auVar29._0_4_ = auVar170._0_4_ * auVar170._0_4_;
    auVar29._8_4_ = auVar170._8_4_ * auVar170._8_4_;
    auVar29._12_4_ = auVar170._12_4_ * auVar170._12_4_;
    auVar29._16_4_ = auVar170._16_4_ * auVar170._16_4_;
    auVar29._20_4_ = auVar170._20_4_ * auVar170._20_4_;
    auVar29._24_4_ = auVar170._24_4_ * auVar170._24_4_;
    auVar29._28_4_ = fVar209;
    fVar240 = auVar10._0_4_;
    fVar244 = auVar10._4_4_;
    fVar219 = auVar10._8_4_;
    fVar223 = auVar10._12_4_;
    fVar224 = auVar10._16_4_;
    fVar208 = auVar10._20_4_;
    fVar209 = auVar10._24_4_;
    auVar30._4_4_ = fVar244 * 4.0 * auVar6._4_4_;
    auVar30._0_4_ = fVar240 * 4.0 * auVar6._0_4_;
    auVar30._8_4_ = fVar219 * 4.0 * auVar6._8_4_;
    auVar30._12_4_ = fVar223 * 4.0 * auVar6._12_4_;
    auVar30._16_4_ = fVar224 * 4.0 * auVar6._16_4_;
    auVar30._20_4_ = fVar208 * 4.0 * auVar6._20_4_;
    auVar30._24_4_ = fVar209 * 4.0 * auVar6._24_4_;
    auVar30._28_4_ = fVar260;
    auVar12 = vsubps_avx(auVar29,auVar30);
    auVar121 = vcmpps_avx(auVar12,auVar236,5);
    auVar264 = ZEXT1632(auVar110);
    fVar260 = auVar10._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      local_ba0._8_4_ = 0x7f800000;
      local_ba0._0_8_ = 0x7f8000007f800000;
      local_ba0._12_4_ = 0x7f800000;
      local_ba0._16_4_ = 0x7f800000;
      local_ba0._20_4_ = 0x7f800000;
      local_ba0._24_4_ = 0x7f800000;
      local_ba0._28_4_ = 0x7f800000;
      auVar197._8_4_ = 0xff800000;
      auVar197._0_8_ = 0xff800000ff800000;
      auVar197._12_4_ = 0xff800000;
      auVar197._16_4_ = 0xff800000;
      auVar197._20_4_ = 0xff800000;
      auVar197._24_4_ = 0xff800000;
      auVar197._28_4_ = 0xff800000;
      auVar236 = local_200;
    }
    else {
      auVar236 = vcmpps_avx(auVar12,auVar236,5);
      auVar12 = vsqrtps_avx(auVar12);
      auVar289._0_4_ = fVar240 + fVar240;
      auVar289._4_4_ = fVar244 + fVar244;
      auVar289._8_4_ = fVar219 + fVar219;
      auVar289._12_4_ = fVar223 + fVar223;
      auVar289._16_4_ = fVar224 + fVar224;
      auVar289._20_4_ = fVar208 + fVar208;
      auVar289._24_4_ = fVar209 + fVar209;
      auVar289._28_4_ = fVar260 + fVar260;
      auVar7 = vrcpps_avx(auVar289);
      auVar171._8_4_ = 0x3f800000;
      auVar171._0_8_ = &DAT_3f8000003f800000;
      auVar171._12_4_ = 0x3f800000;
      auVar171._16_4_ = 0x3f800000;
      auVar171._20_4_ = 0x3f800000;
      auVar171._24_4_ = 0x3f800000;
      auVar171._28_4_ = 0x3f800000;
      auVar5 = vfnmadd213ps_fma(auVar289,auVar7,auVar171);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar7,auVar7);
      auVar282._0_4_ = (uint)auVar170._0_4_ ^ local_720;
      auVar282._4_4_ = (uint)auVar170._4_4_ ^ uStack_71c;
      auVar282._8_4_ = (uint)auVar170._8_4_ ^ uStack_718;
      auVar282._12_4_ = (uint)auVar170._12_4_ ^ uStack_714;
      auVar282._16_4_ = (uint)auVar170._16_4_ ^ (uint)fStack_710;
      auVar282._20_4_ = (uint)auVar170._20_4_ ^ (uint)fStack_70c;
      auVar282._24_4_ = (uint)auVar170._24_4_ ^ (uint)fStack_708;
      auVar282._28_4_ = (uint)auVar170._28_4_ ^ uStack_704;
      auVar7 = vsubps_avx(auVar282,auVar12);
      auVar31._4_4_ = auVar7._4_4_ * auVar5._4_4_;
      auVar31._0_4_ = auVar7._0_4_ * auVar5._0_4_;
      auVar31._8_4_ = auVar7._8_4_ * auVar5._8_4_;
      auVar31._12_4_ = auVar7._12_4_ * auVar5._12_4_;
      auVar31._16_4_ = auVar7._16_4_ * 0.0;
      auVar31._20_4_ = auVar7._20_4_ * 0.0;
      auVar31._24_4_ = auVar7._24_4_ * 0.0;
      auVar31._28_4_ = auVar7._28_4_;
      auVar7 = vsubps_avx(auVar12,auVar170);
      auVar32._4_4_ = auVar5._4_4_ * auVar7._4_4_;
      auVar32._0_4_ = auVar5._0_4_ * auVar7._0_4_;
      auVar32._8_4_ = auVar5._8_4_ * auVar7._8_4_;
      auVar32._12_4_ = auVar5._12_4_ * auVar7._12_4_;
      auVar32._16_4_ = auVar7._16_4_ * 0.0;
      auVar32._20_4_ = auVar7._20_4_ * 0.0;
      auVar32._24_4_ = auVar7._24_4_ * 0.0;
      auVar32._28_4_ = auVar7._28_4_;
      auVar5 = vfmadd213ps_fma(auVar268,auVar31,auVar264);
      local_4e0 = ZEXT1632(CONCAT412(auVar5._12_4_ * fVar210,
                                     CONCAT48(auVar5._8_4_ * fVar242,
                                              CONCAT44(auVar5._4_4_ * fVar239,auVar5._0_4_ * fVar100
                                                      ))));
      auVar5 = vfmadd213ps_fma(auVar268,auVar32,auVar264);
      local_500 = ZEXT1632(CONCAT412(auVar5._12_4_ * fVar210,
                                     CONCAT48(auVar5._8_4_ * fVar242,
                                              CONCAT44(auVar5._4_4_ * fVar239,auVar5._0_4_ * fVar100
                                                      ))));
      auVar143._8_4_ = 0x7f800000;
      auVar143._0_8_ = 0x7f8000007f800000;
      auVar143._12_4_ = 0x7f800000;
      auVar143._16_4_ = 0x7f800000;
      auVar143._20_4_ = 0x7f800000;
      auVar143._24_4_ = 0x7f800000;
      auVar143._28_4_ = 0x7f800000;
      local_ba0 = vblendvps_avx(auVar143,auVar31,auVar236);
      auVar62._4_4_ = uStack_83c;
      auVar62._0_4_ = local_840;
      auVar62._8_4_ = uStack_838;
      auVar62._12_4_ = uStack_834;
      auVar62._16_4_ = uStack_830;
      auVar62._20_4_ = uStack_82c;
      auVar62._24_4_ = uStack_828;
      auVar62._28_4_ = uStack_824;
      auVar7 = vandps_avx(auVar28,auVar62);
      auVar7 = vmaxps_avx(local_4a0,auVar7);
      auVar13._4_4_ = auVar7._4_4_ * 1.9073486e-06;
      auVar13._0_4_ = auVar7._0_4_ * 1.9073486e-06;
      auVar13._8_4_ = auVar7._8_4_ * 1.9073486e-06;
      auVar13._12_4_ = auVar7._12_4_ * 1.9073486e-06;
      auVar13._16_4_ = auVar7._16_4_ * 1.9073486e-06;
      auVar13._20_4_ = auVar7._20_4_ * 1.9073486e-06;
      auVar13._24_4_ = auVar7._24_4_ * 1.9073486e-06;
      auVar13._28_4_ = auVar7._28_4_;
      auVar7 = vandps_avx(auVar10,auVar62);
      auVar7 = vcmpps_avx(auVar7,auVar13,1);
      auVar144._8_4_ = 0xff800000;
      auVar144._0_8_ = 0xff800000ff800000;
      auVar144._12_4_ = 0xff800000;
      auVar144._16_4_ = 0xff800000;
      auVar144._20_4_ = 0xff800000;
      auVar144._24_4_ = 0xff800000;
      auVar144._28_4_ = 0xff800000;
      auVar197 = vblendvps_avx(auVar144,auVar32,auVar236);
      auVar12 = auVar236 & auVar7;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar121 = vandps_avx(auVar7,auVar236);
        auVar6 = vcmpps_avx(auVar6,_DAT_02020f00,2);
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
        auVar157._8_4_ = 0x7f800000;
        auVar157._0_8_ = 0x7f8000007f800000;
        auVar157._12_4_ = 0x7f800000;
        auVar157._16_4_ = 0x7f800000;
        auVar157._20_4_ = 0x7f800000;
        auVar157._24_4_ = 0x7f800000;
        auVar157._28_4_ = 0x7f800000;
        auVar7 = vblendvps_avx(auVar157,auVar124,auVar6);
        auVar5 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar13 = vpmovsxwd_avx2(auVar5);
        local_ba0 = vblendvps_avx(local_ba0,auVar7,auVar13);
        auVar7 = vblendvps_avx(auVar124,auVar157,auVar6);
        auVar197 = vblendvps_avx(auVar197,auVar7,auVar13);
        auVar207._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
        auVar207._8_4_ = auVar121._8_4_ ^ 0xffffffff;
        auVar207._12_4_ = auVar121._12_4_ ^ 0xffffffff;
        auVar207._16_4_ = auVar121._16_4_ ^ 0xffffffff;
        auVar207._20_4_ = auVar121._20_4_ ^ 0xffffffff;
        auVar207._24_4_ = auVar121._24_4_ ^ 0xffffffff;
        auVar207._28_4_ = auVar121._28_4_ ^ 0xffffffff;
        auVar121 = vorps_avx(auVar6,auVar207);
        auVar121 = vandps_avx(auVar236,auVar121);
      }
      auVar287 = ZEXT3264(auVar13);
    }
    auVar293 = ZEXT3264(auVar7);
    auVar256 = ZEXT3264(auVar236);
    auVar7 = local_220 & auVar121;
    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0x7f,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar7 >> 0xbf,0) != '\0') ||
        (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0') {
      fVar227 = *(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_;
      auVar234._4_4_ = fVar227;
      auVar234._0_4_ = fVar227;
      auVar234._8_4_ = fVar227;
      auVar234._12_4_ = fVar227;
      auVar234._16_4_ = fVar227;
      auVar234._20_4_ = fVar227;
      auVar234._24_4_ = fVar227;
      auVar234._28_4_ = fVar227;
      auVar12 = vminps_avx(auVar234,auVar197);
      auVar33._4_4_ = fVar259 * fVar307;
      auVar33._0_4_ = fVar258 * fVar305;
      auVar33._8_4_ = fVar273 * fVar308;
      auVar33._12_4_ = fVar274 * fVar309;
      auVar33._16_4_ = fVar275 * fVar310;
      auVar33._20_4_ = fVar276 * fVar311;
      auVar33._24_4_ = fVar277 * fVar312;
      auVar33._28_4_ = fVar227;
      auVar5 = vfmadd213ps_fma(auVar118,local_9e0,auVar33);
      auVar110 = vfmadd213ps_fma(auVar235,local_700,ZEXT1632(auVar5));
      auVar34._4_4_ = fVar307 * (float)local_960._4_4_;
      auVar34._0_4_ = fVar305 * (float)local_960._0_4_;
      auVar34._8_4_ = fVar308 * fStack_958;
      auVar34._12_4_ = fVar309 * fStack_954;
      auVar34._16_4_ = fVar310 * fStack_950;
      auVar34._20_4_ = fVar311 * fStack_94c;
      auVar34._24_4_ = fVar312 * fStack_948;
      auVar34._28_4_ = fVar227;
      auVar5 = vfmadd231ps_fma(auVar34,_local_820,local_9e0);
      auVar279 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_a00,local_700);
      auVar63._4_4_ = uStack_83c;
      auVar63._0_4_ = local_840;
      auVar63._8_4_ = uStack_838;
      auVar63._12_4_ = uStack_834;
      auVar63._16_4_ = uStack_830;
      auVar63._20_4_ = uStack_82c;
      auVar63._24_4_ = uStack_828;
      auVar63._28_4_ = uStack_824;
      auVar7 = vandps_avx(ZEXT1632(auVar279),auVar63);
      auVar145._8_4_ = 0x219392ef;
      auVar145._0_8_ = 0x219392ef219392ef;
      auVar145._12_4_ = 0x219392ef;
      auVar145._16_4_ = 0x219392ef;
      auVar145._20_4_ = 0x219392ef;
      auVar145._24_4_ = 0x219392ef;
      auVar145._28_4_ = 0x219392ef;
      auVar6 = vcmpps_avx(auVar7,auVar145,1);
      auVar7 = vrcpps_avx(ZEXT1632(auVar279));
      auVar290._8_4_ = 0x3f800000;
      auVar290._0_8_ = &DAT_3f8000003f800000;
      auVar290._12_4_ = 0x3f800000;
      auVar290._16_4_ = 0x3f800000;
      auVar290._20_4_ = 0x3f800000;
      auVar290._24_4_ = 0x3f800000;
      auVar290._28_4_ = 0x3f800000;
      auVar235 = ZEXT1632(auVar279);
      auVar5 = vfnmadd213ps_fma(auVar7,auVar235,auVar290);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar7,auVar7);
      auVar271._0_4_ = auVar279._0_4_ ^ local_720;
      auVar271._4_4_ = auVar279._4_4_ ^ uStack_71c;
      auVar271._8_4_ = auVar279._8_4_ ^ uStack_718;
      auVar271._12_4_ = auVar279._12_4_ ^ uStack_714;
      auVar271._16_4_ = fStack_710;
      auVar271._20_4_ = fStack_70c;
      auVar271._24_4_ = fStack_708;
      auVar271._28_4_ = uStack_704;
      auVar283._0_4_ = auVar5._0_4_ * (float)(auVar110._0_4_ ^ local_720);
      auVar283._4_4_ = auVar5._4_4_ * (float)(auVar110._4_4_ ^ uStack_71c);
      auVar283._8_4_ = auVar5._8_4_ * (float)(auVar110._8_4_ ^ uStack_718);
      auVar283._12_4_ = auVar5._12_4_ * (float)(auVar110._12_4_ ^ uStack_714);
      auVar283._16_4_ = fStack_710 * 0.0;
      auVar283._20_4_ = fStack_70c * 0.0;
      auVar283._24_4_ = fStack_708 * 0.0;
      auVar283._28_4_ = 0;
      auVar7 = vcmpps_avx(auVar235,auVar271,1);
      auVar7 = vorps_avx(auVar6,auVar7);
      auVar291._8_4_ = 0xff800000;
      auVar291._0_8_ = 0xff800000ff800000;
      auVar291._12_4_ = 0xff800000;
      auVar291._16_4_ = 0xff800000;
      auVar291._20_4_ = 0xff800000;
      auVar291._24_4_ = 0xff800000;
      auVar291._28_4_ = 0xff800000;
      auVar7 = vblendvps_avx(auVar283,auVar291,auVar7);
      auVar85._4_4_ = fStack_25c;
      auVar85._0_4_ = local_260;
      auVar85._8_4_ = fStack_258;
      auVar85._12_4_ = fStack_254;
      auVar85._16_4_ = fStack_250;
      auVar85._20_4_ = fStack_24c;
      auVar85._24_4_ = fStack_248;
      auVar85._28_4_ = fStack_244;
      auVar118 = vmaxps_avx(auVar85,local_ba0);
      auVar118 = vmaxps_avx(auVar118,auVar7);
      auVar7 = vcmpps_avx(auVar235,auVar271,6);
      auVar7 = vorps_avx(auVar6,auVar7);
      auVar251._8_4_ = 0x7f800000;
      auVar251._0_8_ = 0x7f8000007f800000;
      auVar251._12_4_ = 0x7f800000;
      auVar251._16_4_ = 0x7f800000;
      auVar251._20_4_ = 0x7f800000;
      auVar251._24_4_ = 0x7f800000;
      auVar251._28_4_ = 0x7f800000;
      auVar7 = vblendvps_avx(auVar283,auVar251,auVar7);
      auVar235 = vminps_avx(auVar12,auVar7);
      auVar7 = vsubps_avx(ZEXT832(0) << 0x20,_local_900);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,local_a20);
      auVar35._4_4_ = auVar6._4_4_ * fVar238;
      auVar35._0_4_ = auVar6._0_4_ * fVar229;
      auVar35._8_4_ = auVar6._8_4_ * fVar241;
      auVar35._12_4_ = auVar6._12_4_ * fVar243;
      auVar35._16_4_ = auVar6._16_4_ * fVar220;
      auVar35._20_4_ = auVar6._20_4_ * fVar221;
      auVar35._24_4_ = auVar6._24_4_ * fVar222;
      auVar35._28_4_ = auVar6._28_4_;
      auVar5 = vfnmsub231ps_fma(auVar35,local_ae0,auVar7);
      auVar7 = vsubps_avx(ZEXT832(0) << 0x20,local_940);
      auVar110 = vfnmadd231ps_fma(ZEXT1632(auVar5),local_ac0,auVar7);
      auVar36._4_4_ = fVar238 * (float)local_960._4_4_;
      auVar36._0_4_ = fVar229 * (float)local_960._0_4_;
      auVar36._8_4_ = fVar241 * fStack_958;
      auVar36._12_4_ = fVar243 * fStack_954;
      auVar36._16_4_ = fVar220 * fStack_950;
      auVar36._20_4_ = fVar221 * fStack_94c;
      auVar36._24_4_ = fVar222 * fStack_948;
      auVar36._28_4_ = auVar7._28_4_;
      auVar5 = vfnmsub231ps_fma(auVar36,local_ae0,_local_820);
      auVar279 = vfnmadd231ps_fma(ZEXT1632(auVar5),_local_a00,local_ac0);
      auVar304._8_4_ = 0x3f800000;
      auVar304._0_8_ = &DAT_3f8000003f800000;
      auVar304._12_4_ = 0x3f800000;
      auVar304._16_4_ = 0x3f800000;
      auVar304._20_4_ = 0x3f800000;
      auVar304._24_4_ = 0x3f800000;
      auVar304._28_4_ = 0x3f800000;
      auVar7 = vandps_avx(ZEXT1632(auVar279),auVar63);
      auVar12 = vrcpps_avx(ZEXT1632(auVar279));
      auVar172._8_4_ = 0x219392ef;
      auVar172._0_8_ = 0x219392ef219392ef;
      auVar172._12_4_ = 0x219392ef;
      auVar172._16_4_ = 0x219392ef;
      auVar172._20_4_ = 0x219392ef;
      auVar172._24_4_ = 0x219392ef;
      auVar172._28_4_ = 0x219392ef;
      auVar6 = vcmpps_avx(auVar7,auVar172,1);
      auVar272 = ZEXT3264(auVar6);
      auVar236 = ZEXT1632(auVar279);
      auVar5 = vfnmadd213ps_fma(auVar12,auVar236,auVar304);
      auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar12,auVar12);
      auVar284._0_4_ = auVar279._0_4_ ^ local_720;
      auVar284._4_4_ = auVar279._4_4_ ^ uStack_71c;
      auVar284._8_4_ = auVar279._8_4_ ^ uStack_718;
      auVar284._12_4_ = auVar279._12_4_ ^ uStack_714;
      auVar284._16_4_ = fStack_710;
      auVar284._20_4_ = fStack_70c;
      auVar284._24_4_ = fStack_708;
      auVar284._28_4_ = uStack_704;
      auVar287 = ZEXT3264(auVar284);
      auVar37._4_4_ = auVar5._4_4_ * (float)(auVar110._4_4_ ^ uStack_71c);
      auVar37._0_4_ = auVar5._0_4_ * (float)(auVar110._0_4_ ^ local_720);
      auVar37._8_4_ = auVar5._8_4_ * (float)(auVar110._8_4_ ^ uStack_718);
      auVar37._12_4_ = auVar5._12_4_ * (float)(auVar110._12_4_ ^ uStack_714);
      auVar37._16_4_ = fStack_710 * 0.0;
      auVar37._20_4_ = fStack_70c * 0.0;
      auVar37._24_4_ = fStack_708 * 0.0;
      auVar37._28_4_ = uStack_704;
      auVar256 = ZEXT3264(auVar37);
      auVar7 = vcmpps_avx(auVar236,auVar284,1);
      auVar7 = vorps_avx(auVar6,auVar7);
      auVar146._8_4_ = 0xff800000;
      auVar146._0_8_ = 0xff800000ff800000;
      auVar146._12_4_ = 0xff800000;
      auVar146._16_4_ = 0xff800000;
      auVar146._20_4_ = 0xff800000;
      auVar146._24_4_ = 0xff800000;
      auVar146._28_4_ = 0xff800000;
      auVar7 = vblendvps_avx(auVar37,auVar146,auVar7);
      auVar293 = ZEXT3264(auVar7);
      _local_800 = vmaxps_avx(auVar118,auVar7);
      auVar7 = vcmpps_avx(auVar236,auVar284,6);
      auVar7 = vorps_avx(auVar6,auVar7);
      auVar173._8_4_ = 0x7f800000;
      auVar173._0_8_ = 0x7f8000007f800000;
      auVar173._12_4_ = 0x7f800000;
      auVar173._16_4_ = 0x7f800000;
      auVar173._20_4_ = 0x7f800000;
      auVar173._24_4_ = 0x7f800000;
      auVar173._28_4_ = 0x7f800000;
      auVar7 = vblendvps_avx(auVar37,auVar173,auVar7);
      auVar121 = vandps_avx(auVar121,local_220);
      local_2a0 = vminps_avx(auVar235,auVar7);
      auVar7 = vcmpps_avx(_local_800,local_2a0,2);
      auVar6 = auVar121 & auVar7;
      if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0x7f,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0xbf,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      {
        auVar6 = vminps_avx(local_4e0,auVar304);
        auVar51 = ZEXT412(0);
        auVar287 = ZEXT1264(auVar51) << 0x20;
        auVar6 = vmaxps_avx(auVar6,ZEXT1232(auVar51) << 0x20);
        auVar118 = vminps_avx(local_500,auVar304);
        auVar118 = vmaxps_avx(auVar118,ZEXT1232(auVar51) << 0x20);
        fVar229 = DAT_02020f40._28_4_;
        auVar38._4_4_ = (auVar6._4_4_ + DAT_02020f40._4_4_) * 0.125;
        auVar38._0_4_ = (auVar6._0_4_ + (float)DAT_02020f40) * 0.125;
        auVar38._8_4_ = (auVar6._8_4_ + DAT_02020f40._8_4_) * 0.125;
        auVar38._12_4_ = (auVar6._12_4_ + DAT_02020f40._12_4_) * 0.125;
        auVar38._16_4_ = (auVar6._16_4_ + DAT_02020f40._16_4_) * 0.125;
        auVar38._20_4_ = (auVar6._20_4_ + DAT_02020f40._20_4_) * 0.125;
        auVar38._24_4_ = (auVar6._24_4_ + DAT_02020f40._24_4_) * 0.125;
        auVar38._28_4_ = auVar6._28_4_ + fVar229;
        auVar293 = ZEXT3264(local_760);
        auVar5 = vfmadd213ps_fma(auVar38,local_760,local_980);
        auVar39._4_4_ = (auVar118._4_4_ + DAT_02020f40._4_4_) * 0.125;
        auVar39._0_4_ = (auVar118._0_4_ + (float)DAT_02020f40) * 0.125;
        auVar39._8_4_ = (auVar118._8_4_ + DAT_02020f40._8_4_) * 0.125;
        auVar39._12_4_ = (auVar118._12_4_ + DAT_02020f40._12_4_) * 0.125;
        auVar39._16_4_ = (auVar118._16_4_ + DAT_02020f40._16_4_) * 0.125;
        auVar39._20_4_ = (auVar118._20_4_ + DAT_02020f40._20_4_) * 0.125;
        auVar39._24_4_ = (auVar118._24_4_ + DAT_02020f40._24_4_) * 0.125;
        auVar39._28_4_ = auVar118._28_4_ + fVar229;
        auVar110 = vfmadd213ps_fma(auVar39,local_760,local_980);
        auVar6 = vminps_avx(local_780,auVar250);
        auVar118 = vminps_avx(local_7c0,auVar14);
        auVar6 = vminps_avx(auVar6,auVar118);
        auVar217 = vsubps_avx(auVar6,auVar217);
        auVar121 = vandps_avx(auVar7,auVar121);
        local_4e0 = ZEXT1632(auVar5);
        local_500 = ZEXT1632(auVar110);
        auVar40._4_4_ = auVar217._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar217._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar217._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar217._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar217._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar217._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar217._24_4_ * 0.99999976;
        auVar40._28_4_ = auVar217._28_4_;
        auVar217 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar217._4_4_ * auVar217._4_4_;
        auVar41._0_4_ = auVar217._0_4_ * auVar217._0_4_;
        auVar41._8_4_ = auVar217._8_4_ * auVar217._8_4_;
        auVar41._12_4_ = auVar217._12_4_ * auVar217._12_4_;
        auVar41._16_4_ = auVar217._16_4_ * auVar217._16_4_;
        auVar41._20_4_ = auVar217._20_4_ * auVar217._20_4_;
        auVar41._24_4_ = auVar217._24_4_ * auVar217._24_4_;
        auVar41._28_4_ = auVar217._28_4_;
        auVar7 = vsubps_avx(auVar11,auVar41);
        auVar42._4_4_ = auVar7._4_4_ * fVar244 * 4.0;
        auVar42._0_4_ = auVar7._0_4_ * fVar240 * 4.0;
        auVar42._8_4_ = auVar7._8_4_ * fVar219 * 4.0;
        auVar42._12_4_ = auVar7._12_4_ * fVar223 * 4.0;
        auVar42._16_4_ = auVar7._16_4_ * fVar224 * 4.0;
        auVar42._20_4_ = auVar7._20_4_ * fVar208 * 4.0;
        auVar42._24_4_ = auVar7._24_4_ * fVar209 * 4.0;
        auVar42._28_4_ = auVar217._28_4_;
        auVar6 = vsubps_avx(auVar29,auVar42);
        auVar272 = ZEXT3264(auVar6);
        auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
        local_880 = ZEXT832(0) << 0x20;
        auVar217 = vcmpps_avx(auVar6,ZEXT1232(auVar51) << 0x20,5);
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar217 >> 0x7f,0) == '\0') &&
              (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar217 >> 0xbf,0) == '\0') &&
            (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar217[0x1f]) {
          _local_8a0 = ZEXT832(0) << 0x20;
          auVar147 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar179 = ZEXT864(0) << 0x20;
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar256 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
          _local_860 = local_880;
        }
        else {
          auVar235 = vsqrtps_avx(auVar6);
          local_280 = auVar10;
          auVar252._0_4_ = fVar240 + fVar240;
          auVar252._4_4_ = fVar244 + fVar244;
          auVar252._8_4_ = fVar219 + fVar219;
          auVar252._12_4_ = fVar223 + fVar223;
          auVar252._16_4_ = fVar224 + fVar224;
          auVar252._20_4_ = fVar208 + fVar208;
          auVar252._24_4_ = fVar209 + fVar209;
          auVar252._28_4_ = fVar260 + fVar260;
          auVar118 = vrcpps_avx(auVar252);
          auVar5 = vfnmadd213ps_fma(auVar252,auVar118,auVar304);
          auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar118,auVar118);
          auVar285._0_4_ = (uint)auVar170._0_4_ ^ local_720;
          auVar285._4_4_ = (uint)auVar170._4_4_ ^ uStack_71c;
          auVar285._8_4_ = (uint)auVar170._8_4_ ^ uStack_718;
          auVar285._12_4_ = (uint)auVar170._12_4_ ^ uStack_714;
          auVar285._16_4_ = (uint)auVar170._16_4_ ^ (uint)fStack_710;
          auVar285._20_4_ = (uint)auVar170._20_4_ ^ (uint)fStack_70c;
          auVar285._24_4_ = (uint)auVar170._24_4_ ^ (uint)fStack_708;
          auVar285._28_4_ = (uint)auVar170._28_4_ ^ uStack_704;
          auVar118 = vsubps_avx(auVar285,auVar235);
          auVar11 = vsubps_avx(auVar235,auVar170);
          fVar260 = auVar118._0_4_ * auVar5._0_4_;
          fVar238 = auVar118._4_4_ * auVar5._4_4_;
          auVar43._4_4_ = fVar238;
          auVar43._0_4_ = fVar260;
          fVar240 = auVar118._8_4_ * auVar5._8_4_;
          auVar43._8_4_ = fVar240;
          fVar241 = auVar118._12_4_ * auVar5._12_4_;
          auVar43._12_4_ = fVar241;
          fVar244 = auVar118._16_4_ * 0.0;
          auVar43._16_4_ = fVar244;
          fVar243 = auVar118._20_4_ * 0.0;
          auVar43._20_4_ = fVar243;
          fVar219 = auVar118._24_4_ * 0.0;
          auVar43._24_4_ = fVar219;
          auVar43._28_4_ = auVar235._28_4_;
          fVar220 = auVar11._0_4_ * auVar5._0_4_;
          fVar221 = auVar11._4_4_ * auVar5._4_4_;
          auVar44._4_4_ = fVar221;
          auVar44._0_4_ = fVar220;
          fVar222 = auVar11._8_4_ * auVar5._8_4_;
          auVar44._8_4_ = fVar222;
          fVar223 = auVar11._12_4_ * auVar5._12_4_;
          auVar44._12_4_ = fVar223;
          fVar224 = auVar11._16_4_ * 0.0;
          auVar44._16_4_ = fVar224;
          fVar208 = auVar11._20_4_ * 0.0;
          auVar44._20_4_ = fVar208;
          fVar209 = auVar11._24_4_ * 0.0;
          auVar44._24_4_ = fVar209;
          auVar44._28_4_ = auVar118._28_4_;
          auVar287 = ZEXT3264(auVar44);
          auVar5 = vfmadd213ps_fma(auVar268,auVar43,auVar264);
          auVar110 = vfmadd213ps_fma(auVar268,auVar44,auVar264);
          auVar118 = ZEXT1632(CONCAT412(fVar210 * auVar5._12_4_,
                                        CONCAT48(fVar242 * auVar5._8_4_,
                                                 CONCAT44(fVar239 * auVar5._4_4_,
                                                          fVar100 * auVar5._0_4_))));
          auVar235 = ZEXT1632(CONCAT412(fVar210 * auVar110._12_4_,
                                        CONCAT48(fVar242 * auVar110._8_4_,
                                                 CONCAT44(fVar239 * auVar110._4_4_,
                                                          fVar100 * auVar110._0_4_))));
          auVar5 = vfmadd213ps_fma(auVar8,auVar118,auVar142);
          auVar110 = vfmadd213ps_fma(auVar8,auVar235,auVar142);
          auVar279 = vfmadd213ps_fma(auVar147,auVar118,auVar169);
          auVar306 = vfmadd213ps_fma(auVar147,auVar235,auVar169);
          auVar232 = vfmadd213ps_fma(auVar118,auVar9,auVar303);
          auVar248 = vfmadd213ps_fma(auVar9,auVar235,auVar303);
          auVar45._4_4_ = (float)local_a00._4_4_ * fVar238;
          auVar45._0_4_ = (float)local_a00._0_4_ * fVar260;
          auVar45._8_4_ = fStack_9f8 * fVar240;
          auVar45._12_4_ = fStack_9f4 * fVar241;
          auVar45._16_4_ = fStack_9f0 * fVar244;
          auVar45._20_4_ = fStack_9ec * fVar243;
          auVar45._24_4_ = fStack_9e8 * fVar219;
          auVar45._28_4_ = 0;
          auVar118 = vsubps_avx(auVar45,ZEXT1632(auVar5));
          auVar90._4_4_ = (float)local_820._4_4_ * fVar238;
          auVar90._0_4_ = (float)local_820._0_4_ * fVar260;
          auVar90._8_4_ = fStack_818 * fVar240;
          auVar90._12_4_ = fStack_814 * fVar241;
          auVar90._16_4_ = fStack_810 * fVar244;
          auVar90._20_4_ = fStack_80c * fVar243;
          auVar90._24_4_ = fStack_808 * fVar219;
          auVar90._28_4_ = fVar229;
          auVar147 = vsubps_avx(auVar90,ZEXT1632(auVar279));
          auVar174._0_4_ = (float)local_960._0_4_ * fVar260;
          auVar174._4_4_ = (float)local_960._4_4_ * fVar238;
          auVar174._8_4_ = fStack_958 * fVar240;
          auVar174._12_4_ = fStack_954 * fVar241;
          auVar174._16_4_ = fStack_950 * fVar244;
          auVar174._20_4_ = fStack_94c * fVar243;
          auVar174._24_4_ = fStack_948 * fVar219;
          auVar174._28_4_ = 0;
          auVar8 = vsubps_avx(auVar174,ZEXT1632(auVar232));
          auVar179 = ZEXT3264(auVar8);
          auVar253._0_4_ = (float)local_a00._0_4_ * fVar220;
          auVar253._4_4_ = (float)local_a00._4_4_ * fVar221;
          auVar253._8_4_ = fStack_9f8 * fVar222;
          auVar253._12_4_ = fStack_9f4 * fVar223;
          auVar253._16_4_ = fStack_9f0 * fVar224;
          auVar253._20_4_ = fStack_9ec * fVar208;
          auVar253._24_4_ = fStack_9e8 * fVar209;
          auVar253._28_4_ = 0;
          _local_860 = vsubps_avx(auVar253,ZEXT1632(auVar110));
          auVar46._4_4_ = (float)local_820._4_4_ * fVar221;
          auVar46._0_4_ = (float)local_820._0_4_ * fVar220;
          auVar46._8_4_ = fStack_818 * fVar222;
          auVar46._12_4_ = fStack_814 * fVar223;
          auVar46._16_4_ = fStack_810 * fVar224;
          auVar46._20_4_ = fStack_80c * fVar208;
          auVar46._24_4_ = fStack_808 * fVar209;
          auVar46._28_4_ = local_860._28_4_;
          local_880 = vsubps_avx(auVar46,ZEXT1632(auVar306));
          auVar47._4_4_ = (float)local_960._4_4_ * fVar221;
          auVar47._0_4_ = (float)local_960._0_4_ * fVar220;
          auVar47._8_4_ = fStack_958 * fVar222;
          auVar47._12_4_ = fStack_954 * fVar223;
          auVar47._16_4_ = fStack_950 * fVar224;
          auVar47._20_4_ = fStack_94c * fVar208;
          auVar47._24_4_ = fStack_948 * fVar209;
          auVar47._28_4_ = local_880._28_4_;
          _local_8a0 = vsubps_avx(auVar47,ZEXT1632(auVar248));
          auVar293 = ZEXT864(0) << 0x20;
          auVar8 = vcmpps_avx(auVar6,_DAT_02020f00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar237 = vblendvps_avx(auVar254,auVar43,auVar8);
          auVar64._4_4_ = uStack_83c;
          auVar64._0_4_ = local_840;
          auVar64._8_4_ = uStack_838;
          auVar64._12_4_ = uStack_834;
          auVar64._16_4_ = uStack_830;
          auVar64._20_4_ = uStack_82c;
          auVar64._24_4_ = uStack_828;
          auVar64._28_4_ = uStack_824;
          auVar6 = vandps_avx(auVar64,auVar28);
          auVar6 = vmaxps_avx(local_4a0,auVar6);
          auVar272 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar48._4_4_ = auVar6._4_4_ * 1.9073486e-06;
          auVar48._0_4_ = auVar6._0_4_ * 1.9073486e-06;
          auVar48._8_4_ = auVar6._8_4_ * 1.9073486e-06;
          auVar48._12_4_ = auVar6._12_4_ * 1.9073486e-06;
          auVar48._16_4_ = auVar6._16_4_ * 1.9073486e-06;
          auVar48._20_4_ = auVar6._20_4_ * 1.9073486e-06;
          auVar48._24_4_ = auVar6._24_4_ * 1.9073486e-06;
          auVar48._28_4_ = auVar6._28_4_;
          auVar6 = vandps_avx(auVar64,auVar10);
          auVar9 = vcmpps_avx(auVar6,auVar48,1);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar6 = vblendvps_avx(auVar255,auVar44,auVar8);
          auVar256 = ZEXT3264(auVar6);
          auVar235 = auVar8 & auVar9;
          if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar235 >> 0x7f,0) != '\0') ||
                (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar235 >> 0xbf,0) != '\0') ||
              (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar235[0x1f] < '\0') {
            auVar217 = vandps_avx(auVar9,auVar8);
            auVar9 = vcmpps_avx(auVar7,ZEXT832(0) << 0x20,2);
            auVar286._8_4_ = 0xff800000;
            auVar286._0_8_ = 0xff800000ff800000;
            auVar286._12_4_ = 0xff800000;
            auVar286._16_4_ = 0xff800000;
            auVar286._20_4_ = 0xff800000;
            auVar286._24_4_ = 0xff800000;
            auVar286._28_4_ = 0xff800000;
            auVar287 = ZEXT3264(auVar286);
            auVar292._8_4_ = 0x7f800000;
            auVar292._0_8_ = 0x7f8000007f800000;
            auVar292._12_4_ = 0x7f800000;
            auVar292._16_4_ = 0x7f800000;
            auVar292._20_4_ = 0x7f800000;
            auVar292._24_4_ = 0x7f800000;
            auVar292._28_4_ = 0x7f800000;
            auVar293 = ZEXT3264(auVar292);
            auVar7 = vblendvps_avx(auVar292,auVar286,auVar9);
            auVar5 = vpackssdw_avx(auVar217._0_16_,auVar217._16_16_);
            auVar235 = vpmovsxwd_avx2(auVar5);
            auVar237 = vblendvps_avx(auVar237,auVar7,auVar235);
            auVar7 = vblendvps_avx(auVar286,auVar292,auVar9);
            auVar272 = ZEXT3264(auVar7);
            auVar7 = vblendvps_avx(auVar6,auVar7,auVar235);
            auVar256 = ZEXT3264(auVar7);
            auVar218._0_8_ = auVar217._0_8_ ^ 0xffffffffffffffff;
            auVar218._8_4_ = auVar217._8_4_ ^ 0xffffffff;
            auVar218._12_4_ = auVar217._12_4_ ^ 0xffffffff;
            auVar218._16_4_ = auVar217._16_4_ ^ 0xffffffff;
            auVar218._20_4_ = auVar217._20_4_ ^ 0xffffffff;
            auVar218._24_4_ = auVar217._24_4_ ^ 0xffffffff;
            auVar218._28_4_ = auVar217._28_4_ ^ 0xffffffff;
            auVar217 = vorps_avx(auVar9,auVar218);
            auVar217 = vandps_avx(auVar8,auVar217);
          }
        }
        auVar302 = local_960._0_28_;
        local_300 = _local_800;
        local_2e0 = vminps_avx(local_2a0,auVar237);
        _local_560 = vmaxps_avx(_local_800,auVar256._0_32_);
        _local_2c0 = _local_560;
        auVar7 = vcmpps_avx(_local_800,local_2e0,2);
        local_520 = vandps_avx(auVar7,auVar121);
        auVar7 = vcmpps_avx(_local_560,local_2a0,2);
        local_600 = vandps_avx(auVar7,auVar121);
        auVar121 = vorps_avx(local_600,local_520);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_5a0._0_8_ = auVar217._0_8_ ^ 0xffffffffffffffff;
          local_5a0._8_4_ = auVar217._8_4_ ^ 0xffffffff;
          local_5a0._12_4_ = auVar217._12_4_ ^ 0xffffffff;
          local_5a0._16_4_ = auVar217._16_4_ ^ 0xffffffff;
          local_5a0._20_4_ = auVar217._20_4_ ^ 0xffffffff;
          local_5a0._24_4_ = auVar217._24_4_ ^ 0xffffffff;
          local_5a0._28_4_ = auVar217._28_4_ ^ 0xffffffff;
          auVar265._0_4_ = (float)local_960._0_4_ * auVar179._0_4_;
          auVar265._4_4_ = (float)local_960._4_4_ * auVar179._4_4_;
          auVar265._8_4_ = fStack_958 * auVar179._8_4_;
          auVar265._12_4_ = fStack_954 * auVar179._12_4_;
          auVar265._16_4_ = fStack_950 * auVar179._16_4_;
          auVar265._20_4_ = fStack_94c * auVar179._20_4_;
          auVar265._28_36_ = auVar179._28_36_;
          auVar265._24_4_ = fStack_948 * auVar179._24_4_;
          auVar5 = vfmadd132ps_fma(auVar147,auVar265._0_32_,_local_820);
          auVar5 = vfmadd213ps_fma(auVar118,_local_a00,ZEXT1632(auVar5));
          auVar65._4_4_ = uStack_83c;
          auVar65._0_4_ = local_840;
          auVar65._8_4_ = uStack_838;
          auVar65._12_4_ = uStack_834;
          auVar65._16_4_ = uStack_830;
          auVar65._20_4_ = uStack_82c;
          auVar65._24_4_ = uStack_828;
          auVar65._28_4_ = uStack_824;
          auVar121 = vandps_avx(ZEXT1632(auVar5),auVar65);
          auVar149._8_4_ = 0x3e99999a;
          auVar149._0_8_ = 0x3e99999a3e99999a;
          auVar149._12_4_ = 0x3e99999a;
          auVar149._16_4_ = 0x3e99999a;
          auVar149._20_4_ = 0x3e99999a;
          auVar149._24_4_ = 0x3e99999a;
          auVar149._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar149,1);
          auVar121 = vorps_avx(auVar121,local_5a0);
          auVar150._8_4_ = 3;
          auVar150._0_8_ = 0x300000003;
          auVar150._12_4_ = 3;
          auVar150._16_4_ = 3;
          auVar150._20_4_ = 3;
          auVar150._24_4_ = 3;
          auVar150._28_4_ = 3;
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar176,auVar150,auVar121);
          uVar96 = (undefined4)uVar97;
          local_5c0._4_4_ = uVar96;
          local_5c0._0_4_ = uVar96;
          local_5c0._8_4_ = uVar96;
          local_5c0._12_4_ = uVar96;
          local_5c0._16_4_ = uVar96;
          local_5c0._20_4_ = uVar96;
          local_5c0._24_4_ = uVar96;
          local_5c0._28_4_ = uVar96;
          local_540 = vpcmpgtd_avx2(auVar121,local_5c0);
          local_5e0 = vpandn_avx2(local_540,local_520);
          auVar179 = ZEXT3264(local_5e0);
          auVar121 = local_520 & ~local_540;
          auStack_618 = auVar14._8_24_;
          local_620 = uVar97;
          local_580 = local_600;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar110 = vminps_avx(local_a30,local_a50);
            auVar5 = vmaxps_avx(local_a30,local_a50);
            auVar279 = vminps_avx(local_a40,_local_a60);
            auVar306 = vminps_avx(auVar110,auVar279);
            auVar110 = vmaxps_avx(local_a40,_local_a60);
            auVar279 = vmaxps_avx(auVar5,auVar110);
            auVar5 = vandps_avx(auVar306,local_a70);
            auVar110 = vandps_avx(auVar279,local_a70);
            auVar5 = vmaxps_avx(auVar5,auVar110);
            auVar110 = vmovshdup_avx(auVar5);
            auVar110 = vmaxss_avx(auVar110,auVar5);
            auVar5 = vshufpd_avx(auVar5,auVar5,1);
            auVar5 = vmaxss_avx(auVar5,auVar110);
            local_940._0_4_ = auVar5._0_4_ * 1.9073486e-06;
            local_7a0 = vshufps_avx(auVar279,auVar279,0xff);
            local_7e0._4_4_ = (float)local_800._4_4_ + fVar126;
            local_7e0._0_4_ = (float)local_800._0_4_ + fVar126;
            fStack_7d8 = fStack_7f8 + fVar126;
            fStack_7d4 = fStack_7f4 + fVar126;
            fStack_7d0 = fStack_7f0 + fVar126;
            fStack_7cc = fStack_7ec + fVar126;
            fStack_7c8 = fStack_7e8 + fVar126;
            fStack_7c4 = fStack_7e4 + fVar126;
            do {
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar121 = auVar179._0_32_;
              auVar217 = vblendvps_avx(auVar151,_local_800,auVar121);
              auVar7 = vshufps_avx(auVar217,auVar217,0xb1);
              auVar7 = vminps_avx(auVar217,auVar7);
              auVar6 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar6);
              auVar6 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar6);
              auVar217 = vcmpps_avx(auVar217,auVar7,0);
              auVar7 = auVar121 & auVar217;
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar7 >> 0x7f,0) != '\0') ||
                    (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0xbf,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar7[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar217,auVar121);
              }
              local_7c0._0_8_ = uVar98;
              uVar91 = vmovmskps_avx(auVar121);
              iVar15 = 0;
              for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              uVar92 = iVar15 << 2;
              *(undefined4 *)(local_5e0 + uVar92) = 0;
              uVar91 = *(uint *)(local_4e0 + uVar92);
              uVar92 = *(uint *)(local_300 + uVar92);
              fVar260 = local_ae4;
              if ((float)local_920._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_920._0_4_);
              }
              auVar272 = ZEXT464(uVar92);
              auVar179 = ZEXT464(uVar91);
              local_740._0_4_ = fVar260 * 1.9073486e-06;
              lVar95 = 5;
              do {
                fVar260 = auVar272._0_4_;
                auVar105._4_4_ = fVar260;
                auVar105._0_4_ = fVar260;
                auVar105._8_4_ = fVar260;
                auVar105._12_4_ = fVar260;
                auVar110 = vfmadd213ps_fma(auVar105,local_910,_DAT_01feba10);
                fVar242 = auVar179._0_4_;
                fVar241 = 1.0 - fVar242;
                local_a20._0_16_ = ZEXT416((uint)fVar241);
                fVar229 = fVar242 * fVar242;
                auVar248 = SUB6416(ZEXT464(0x40400000),0);
                auVar232 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar104 = auVar179._0_16_;
                auVar279 = vfmadd213ss_fma(auVar248,auVar104,auVar232);
                auVar5 = vfmadd213ss_fma(auVar279,ZEXT416((uint)fVar229),
                                         SUB6416(ZEXT464(0x40000000),0));
                auVar306 = vfmadd213ss_fma(auVar248,ZEXT416((uint)fVar241),auVar232);
                auVar306 = vfmadd213ss_fma(auVar306,ZEXT416((uint)(fVar241 * fVar241)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar100 = fVar241 * fVar241 * -fVar242 * 0.5;
                fVar238 = auVar5._0_4_ * 0.5;
                fVar239 = auVar306._0_4_ * 0.5;
                fVar240 = fVar242 * fVar242 * -fVar241 * 0.5;
                auVar181._0_4_ = fVar240 * (float)local_a60._0_4_;
                auVar181._4_4_ = fVar240 * (float)local_a60._4_4_;
                auVar181._8_4_ = fVar240 * fStack_a58;
                auVar181._12_4_ = fVar240 * fStack_a54;
                auVar202._4_4_ = fVar239;
                auVar202._0_4_ = fVar239;
                auVar202._8_4_ = fVar239;
                auVar202._12_4_ = fVar239;
                auVar5 = vfmadd132ps_fma(auVar202,auVar181,local_a40);
                auVar159._4_4_ = fVar238;
                auVar159._0_4_ = fVar238;
                auVar159._8_4_ = fVar238;
                auVar159._12_4_ = fVar238;
                auVar5 = vfmadd132ps_fma(auVar159,auVar5,local_a50);
                auVar182._4_4_ = fVar100;
                auVar182._0_4_ = fVar100;
                auVar182._8_4_ = fVar100;
                auVar182._12_4_ = fVar100;
                auVar5 = vfmadd132ps_fma(auVar182,auVar5,local_a30);
                auVar232 = vfmadd231ss_fma(auVar232,auVar104,ZEXT416(0x41100000));
                auVar306 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar104,
                                           ZEXT416(0x40800000));
                local_9e0._0_16_ = auVar306;
                local_700._0_16_ = auVar5;
                auVar5 = vsubps_avx(auVar110,auVar5);
                _local_900 = auVar5;
                auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar110 = vfmadd213ss_fma(auVar248,auVar104,ZEXT416(0xbf800000));
                local_aa0._0_16_ = auVar110;
                fVar100 = auVar5._0_4_;
                if (fVar100 < 0.0) {
                  local_ac0._0_4_ = auVar279._0_4_;
                  local_ae0._0_4_ = fVar229;
                  local_980._0_4_ = fVar241 * -2.0;
                  local_a20._0_16_ = ZEXT416((uint)fVar241);
                  auVar256._0_4_ = sqrtf(fVar100);
                  auVar256._4_60_ = extraout_var;
                  auVar279 = ZEXT416((uint)local_ac0._0_4_);
                  auVar110 = auVar256._0_16_;
                  fVar238 = (float)local_980._0_4_;
                  fVar229 = (float)local_ae0._0_4_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar5,auVar5);
                  fVar238 = fVar241 * -2.0;
                }
                fVar239 = local_a20._0_4_;
                auVar279 = vfmadd213ss_fma(auVar279,ZEXT416((uint)(fVar242 + fVar242)),
                                           ZEXT416((uint)(fVar242 * fVar242 * 3.0)));
                auVar158 = SUB6416(ZEXT464(0x40000000),0);
                auVar306 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar104,auVar158);
                auVar248 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar239 * -3.0)),
                                           ZEXT416((uint)(fVar239 + fVar239)),auVar306);
                auVar103 = vfnmadd231ss_fma(ZEXT416((uint)(fVar242 * (fVar239 + fVar239))),
                                            local_a20._0_16_,local_a20._0_16_);
                auVar306 = vfmadd213ss_fma(ZEXT416((uint)fVar238),auVar104,ZEXT416((uint)fVar229));
                fVar229 = auVar103._0_4_ * 0.5;
                fVar238 = auVar279._0_4_ * 0.5;
                fVar239 = auVar248._0_4_ * 0.5;
                fVar240 = auVar306._0_4_ * 0.5;
                auVar183._0_4_ = (float)local_a60._0_4_ * fVar240;
                auVar183._4_4_ = (float)local_a60._4_4_ * fVar240;
                auVar183._8_4_ = fStack_a58 * fVar240;
                auVar183._12_4_ = fStack_a54 * fVar240;
                auVar160._4_4_ = fVar239;
                auVar160._0_4_ = fVar239;
                auVar160._8_4_ = fVar239;
                auVar160._12_4_ = fVar239;
                auVar279 = vfmadd213ps_fma(auVar160,local_a40,auVar183);
                auVar130._4_4_ = fVar238;
                auVar130._0_4_ = fVar238;
                auVar130._8_4_ = fVar238;
                auVar130._12_4_ = fVar238;
                auVar279 = vfmadd213ps_fma(auVar130,local_a50,auVar279);
                auVar280._4_4_ = fVar229;
                auVar280._0_4_ = fVar229;
                auVar280._8_4_ = fVar229;
                auVar280._12_4_ = fVar229;
                local_a20._0_16_ = vfmadd213ps_fma(auVar280,local_a30,auVar279);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar104,auVar158);
                auVar106._0_4_ = (float)local_a60._0_4_ * (float)local_aa0._0_4_;
                auVar106._4_4_ = (float)local_a60._4_4_ * (float)local_aa0._0_4_;
                auVar106._8_4_ = fStack_a58 * (float)local_aa0._0_4_;
                auVar106._12_4_ = fStack_a54 * (float)local_aa0._0_4_;
                auVar161._4_4_ = local_9e0._0_4_;
                auVar161._0_4_ = local_9e0._0_4_;
                auVar161._8_4_ = local_9e0._0_4_;
                auVar161._12_4_ = local_9e0._0_4_;
                auVar279 = vfmadd213ps_fma(auVar161,local_a40,auVar106);
                uVar96 = auVar232._0_4_;
                auVar184._4_4_ = uVar96;
                auVar184._0_4_ = uVar96;
                auVar184._8_4_ = uVar96;
                auVar184._12_4_ = uVar96;
                auVar279 = vfmadd213ps_fma(auVar184,local_a50,auVar279);
                auVar306 = vdpps_avx(local_a20._0_16_,local_a20._0_16_,0x7f);
                auVar131._0_4_ = auVar248._0_4_;
                auVar131._4_4_ = auVar131._0_4_;
                auVar131._8_4_ = auVar131._0_4_;
                auVar131._12_4_ = auVar131._0_4_;
                auVar248 = vfmadd213ps_fma(auVar131,local_a30,auVar279);
                auVar279 = vblendps_avx(auVar306,_DAT_01feba10,0xe);
                auVar232 = vrsqrtss_avx(auVar279,auVar279);
                fVar239 = auVar306._0_4_;
                fVar229 = auVar232._0_4_;
                auVar232 = vdpps_avx(local_a20._0_16_,auVar248,0x7f);
                fVar229 = fVar229 * 1.5 + fVar239 * -0.5 * fVar229 * fVar229 * fVar229;
                auVar132._0_4_ = auVar248._0_4_ * fVar239;
                auVar132._4_4_ = auVar248._4_4_ * fVar239;
                auVar132._8_4_ = auVar248._8_4_ * fVar239;
                auVar132._12_4_ = auVar248._12_4_ * fVar239;
                fVar238 = auVar232._0_4_;
                auVar215._0_4_ = local_a20._0_4_ * fVar238;
                auVar215._4_4_ = local_a20._4_4_ * fVar238;
                fVar240 = local_a20._8_4_;
                auVar215._8_4_ = fVar240 * fVar238;
                fVar241 = local_a20._12_4_;
                auVar215._12_4_ = fVar241 * fVar238;
                auVar232 = vsubps_avx(auVar132,auVar215);
                auVar279 = vrcpss_avx(auVar279,auVar279);
                auVar248 = vfnmadd213ss_fma(auVar279,auVar306,auVar158);
                fVar238 = auVar279._0_4_ * auVar248._0_4_;
                auVar279 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar260 * (float)local_740._0_4_)));
                auVar272 = ZEXT1664(auVar279);
                local_ac0._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                local_ac0._8_4_ = -fVar240;
                local_ac0._12_4_ = -fVar241;
                auVar185._0_4_ = fVar229 * auVar232._0_4_ * fVar238;
                auVar185._4_4_ = fVar229 * auVar232._4_4_ * fVar238;
                auVar185._8_4_ = fVar229 * auVar232._8_4_ * fVar238;
                auVar185._12_4_ = fVar229 * auVar232._12_4_ * fVar238;
                auVar231._0_4_ = local_a20._0_4_ * fVar229;
                auVar231._4_4_ = local_a20._4_4_ * fVar229;
                auVar231._8_4_ = fVar240 * fVar229;
                auVar231._12_4_ = fVar241 * fVar229;
                local_9e0._0_4_ = auVar279._0_4_;
                if (fVar239 < -fVar239) {
                  local_aa0._0_4_ = auVar110._0_4_;
                  local_ae0._0_16_ = auVar231;
                  fVar229 = sqrtf(fVar239);
                  auVar272 = ZEXT464((uint)local_9e0._0_4_);
                  auVar110 = ZEXT416((uint)local_aa0._0_4_);
                  auVar231 = local_ae0._0_16_;
                }
                else {
                  auVar279 = vsqrtss_avx(auVar306,auVar306);
                  fVar229 = auVar279._0_4_;
                }
                auVar279 = vdpps_avx(_local_900,auVar231,0x7f);
                auVar248 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar110,auVar272._0_16_);
                auVar306 = vdpps_avx(local_ac0._0_16_,auVar231,0x7f);
                auVar232 = vdpps_avx(_local_900,auVar185,0x7f);
                local_aa0._0_16_ = vdpps_avx(local_910,auVar231,0x7f);
                auVar248 = vfmadd213ss_fma(ZEXT416((uint)(auVar110._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar229)),
                                           auVar248);
                auVar293 = ZEXT1664(auVar248);
                fVar229 = auVar306._0_4_ + auVar232._0_4_;
                auVar107._0_4_ = auVar279._0_4_ * auVar279._0_4_;
                auVar107._4_4_ = auVar279._4_4_ * auVar279._4_4_;
                auVar107._8_4_ = auVar279._8_4_ * auVar279._8_4_;
                auVar107._12_4_ = auVar279._12_4_ * auVar279._12_4_;
                auVar110 = vdpps_avx(_local_900,local_ac0._0_16_,0x7f);
                auVar232 = vsubps_avx(auVar5,auVar107);
                auVar306 = vrsqrtss_avx(auVar232,auVar232);
                fVar239 = auVar232._0_4_;
                fVar238 = auVar306._0_4_;
                fVar238 = fVar238 * 1.5 + fVar239 * -0.5 * fVar238 * fVar238 * fVar238;
                auVar306 = vdpps_avx(_local_900,local_910,0x7f);
                local_ac0._0_16_ = vfnmadd231ss_fma(auVar110,auVar279,ZEXT416((uint)fVar229));
                auVar110 = vfnmadd231ss_fma(auVar306,auVar279,local_aa0._0_16_);
                if (fVar239 < 0.0) {
                  local_ae0._0_16_ = auVar279;
                  local_980._0_16_ = ZEXT416((uint)fVar229);
                  local_760._0_4_ = fVar238;
                  local_780._0_16_ = auVar110;
                  fVar239 = sqrtf(fVar239);
                  auVar293 = ZEXT464(auVar248._0_4_);
                  auVar272 = ZEXT464((uint)local_9e0._0_4_);
                  fVar238 = (float)local_760._0_4_;
                  auVar110 = local_780._0_16_;
                  auVar279 = local_ae0._0_16_;
                  auVar306 = local_980._0_16_;
                }
                else {
                  auVar306 = vsqrtss_avx(auVar232,auVar232);
                  fVar239 = auVar306._0_4_;
                  auVar306 = ZEXT416((uint)fVar229);
                }
                auVar287 = ZEXT1664(auVar279);
                auVar256 = ZEXT3264(_local_960);
                auVar232 = vpermilps_avx(local_700._0_16_,0xff);
                auVar248 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
                auVar104 = vfmsub213ss_fma(local_ac0._0_16_,ZEXT416((uint)fVar238),auVar248);
                auVar186._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = local_aa0._8_4_ ^ 0x80000000;
                auVar186._12_4_ = local_aa0._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar104._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar110 = ZEXT416((uint)(auVar110._0_4_ * fVar238));
                auVar104 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * local_aa0._0_4_)),
                                           auVar306,auVar110);
                auVar110 = vinsertps_avx(auVar110,auVar186,0x10);
                uVar96 = auVar104._0_4_;
                auVar187._4_4_ = uVar96;
                auVar187._0_4_ = uVar96;
                auVar187._8_4_ = uVar96;
                auVar187._12_4_ = uVar96;
                auVar110 = vdivps_avx(auVar110,auVar187);
                auVar104 = ZEXT416((uint)(fVar239 - auVar232._0_4_));
                auVar232 = vinsertps_avx(auVar279,auVar104,0x10);
                auVar162._0_4_ = auVar232._0_4_ * auVar110._0_4_;
                auVar162._4_4_ = auVar232._4_4_ * auVar110._4_4_;
                auVar162._8_4_ = auVar232._8_4_ * auVar110._8_4_;
                auVar162._12_4_ = auVar232._12_4_ * auVar110._12_4_;
                auVar110 = vinsertps_avx(auVar203,auVar306,0x1c);
                auVar110 = vdivps_avx(auVar110,auVar187);
                auVar306 = vhaddps_avx(auVar162,auVar162);
                auVar188._0_4_ = auVar232._0_4_ * auVar110._0_4_;
                auVar188._4_4_ = auVar232._4_4_ * auVar110._4_4_;
                auVar188._8_4_ = auVar232._8_4_ * auVar110._8_4_;
                auVar188._12_4_ = auVar232._12_4_ * auVar110._12_4_;
                auVar110 = vhaddps_avx(auVar188,auVar188);
                fVar242 = fVar242 - auVar306._0_4_;
                auVar179 = ZEXT464((uint)fVar242);
                fVar260 = fVar260 - auVar110._0_4_;
                auVar110 = vandps_avx(auVar279,local_a70);
                bVar49 = true;
                auVar302 = local_960._0_28_;
                if (auVar293._0_4_ <= auVar110._0_4_) {
LAB_016bbef9:
                  auVar272 = ZEXT464((uint)fVar260);
                }
                else {
                  auVar306 = vfmadd231ss_fma(ZEXT416((uint)(auVar272._0_4_ + auVar293._0_4_)),
                                             local_7a0,ZEXT416(0x36000000));
                  auVar110 = vandps_avx(auVar104,local_a70);
                  if (auVar306._0_4_ <= auVar110._0_4_) goto LAB_016bbef9;
                  fVar260 = fVar260 + (float)local_8d0._0_4_;
                  if (fVar260 < fVar99) {
                    bVar49 = false;
                    unaff_BL = 0;
                    goto LAB_016bbef9;
                  }
                  fVar229 = *(float *)(ray + k * 4 + 0x80);
                  auVar110 = ZEXT416((uint)fVar260);
                  bVar49 = false;
                  if (fVar260 <= fVar229) {
                    auVar272 = ZEXT1664(auVar110);
                    if ((fVar242 < 0.0) || (1.0 < fVar242)) {
                      unaff_BL = 0;
                    }
                    else {
                      auVar5 = vrsqrtss_avx(auVar5,auVar5);
                      fVar238 = auVar5._0_4_;
                      pGVar3 = (context->scene->geometries).items[local_af0].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          fVar100 = fVar238 * 1.5 + fVar100 * -0.5 * fVar238 * fVar238 * fVar238;
                          auVar133._0_4_ = fVar100 * (float)local_900._0_4_;
                          auVar133._4_4_ = fVar100 * (float)local_900._4_4_;
                          auVar133._8_4_ = fVar100 * fStack_8f8;
                          auVar133._12_4_ = fVar100 * fStack_8f4;
                          auVar248 = vfmadd213ps_fma(auVar248,auVar133,local_a20._0_16_);
                          auVar5 = vshufps_avx(auVar133,auVar133,0xc9);
                          auVar306 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                          auVar134._0_4_ = auVar133._0_4_ * auVar306._0_4_;
                          auVar134._4_4_ = auVar133._4_4_ * auVar306._4_4_;
                          auVar134._8_4_ = auVar133._8_4_ * auVar306._8_4_;
                          auVar134._12_4_ = auVar133._12_4_ * auVar306._12_4_;
                          auVar232 = vfmsub231ps_fma(auVar134,local_a20._0_16_,auVar5);
                          auVar5 = vshufps_avx(auVar232,auVar232,0xc9);
                          auVar306 = vshufps_avx(auVar248,auVar248,0xc9);
                          auVar232 = vshufps_avx(auVar232,auVar232,0xd2);
                          auVar108._0_4_ = auVar248._0_4_ * auVar232._0_4_;
                          auVar108._4_4_ = auVar248._4_4_ * auVar232._4_4_;
                          auVar108._8_4_ = auVar248._8_4_ * auVar232._8_4_;
                          auVar108._12_4_ = auVar248._12_4_ * auVar232._12_4_;
                          auVar5 = vfmsub231ps_fma(auVar108,auVar5,auVar306);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar5,auVar5,0x55);
                          auStack_6b0 = vshufps_avx(auVar5,auVar5,0xaa);
                          local_6a0 = auVar5._0_4_;
                          local_680 = ZEXT416(0) << 0x20;
                          local_670 = CONCAT44(uStack_6dc,local_6e0);
                          uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                          local_660._4_4_ = uStack_6cc;
                          local_660._0_4_ = local_6d0;
                          local_660._8_4_ = uStack_6c8;
                          local_660._12_4_ = uStack_6c4;
                          vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                          uStack_64c = context->user->instID[0];
                          local_650 = uStack_64c;
                          uStack_648 = uStack_64c;
                          uStack_644 = uStack_64c;
                          uStack_640 = context->user->instPrimID[0];
                          uStack_63c = uStack_640;
                          uStack_638 = uStack_640;
                          uStack_634 = uStack_640;
                          *(float *)(ray + k * 4 + 0x80) = fVar260;
                          local_b00 = *local_9b8;
                          uStack_af8 = local_9b8[1];
                          local_9b0.valid = (int *)&local_b00;
                          local_9b0.geometryUserPtr = pGVar3->userPtr;
                          local_9b0.context = context->user;
                          local_9b0.hit = local_6c0;
                          local_9b0.N = 4;
                          local_9b0.ray = (RTCRayN *)ray;
                          uStack_69c = local_6a0;
                          uStack_698 = local_6a0;
                          uStack_694 = local_6a0;
                          local_690 = fVar242;
                          fStack_68c = fVar242;
                          fStack_688 = fVar242;
                          fStack_684 = fVar242;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar256 = ZEXT1664(local_960._0_16_);
                            auVar287 = ZEXT1664(auVar279);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_9b0);
                            auVar179 = ZEXT1664(ZEXT416((uint)fVar242));
                          }
                          auVar302 = local_960._0_28_;
                          auVar58._8_8_ = uStack_af8;
                          auVar58._0_8_ = local_b00;
                          if (auVar58 == (undefined1  [16])0x0) {
                            auVar5 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar5 = auVar5 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              auVar287 = ZEXT1664(auVar287._0_16_);
                              auVar293 = ZEXT1664(auVar293._0_16_);
                              (*p_Var4)(&local_9b0);
                              auVar179 = ZEXT1664(ZEXT416((uint)fVar242));
                              auVar302 = local_960._0_28_;
                            }
                            auVar59._8_8_ = uStack_af8;
                            auVar59._0_8_ = local_b00;
                            auVar279 = vpcmpeqd_avx((undefined1  [16])0x0,auVar59);
                            auVar5 = auVar279 ^ _DAT_01febe20;
                            auVar163._8_4_ = 0xff800000;
                            auVar163._0_8_ = 0xff800000ff800000;
                            auVar163._12_4_ = 0xff800000;
                            auVar279 = vblendvps_avx(auVar163,*(undefined1 (*) [16])
                                                               (local_9b0.ray + 0x80),auVar279);
                            *(undefined1 (*) [16])(local_9b0.ray + 0x80) = auVar279;
                          }
                          auVar272 = ZEXT1664(auVar110);
                          auVar135._8_8_ = 0x100000001;
                          auVar135._0_8_ = 0x100000001;
                          unaff_BL = (auVar135 & auVar5) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar229;
                          }
                          bVar49 = false;
                          goto LAB_016bbefd;
                        }
                        unaff_BL = 1;
                      }
                      bVar49 = false;
                    }
                  }
                  else {
                    unaff_BL = 0;
                    auVar272 = ZEXT1664(auVar110);
                  }
                }
LAB_016bbefd:
                if (!bVar49) goto LAB_016bc278;
                lVar95 = lVar95 + -1;
              } while (lVar95 != 0);
              unaff_BL = 0;
LAB_016bc278:
              unaff_BL = unaff_BL & 1;
              uVar98 = CONCAT71(local_7c0._1_7_,local_7c0[0] | unaff_BL);
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar122._4_4_ = uVar96;
              auVar122._0_4_ = uVar96;
              auVar122._8_4_ = uVar96;
              auVar122._12_4_ = uVar96;
              auVar122._16_4_ = uVar96;
              auVar122._20_4_ = uVar96;
              auVar122._24_4_ = uVar96;
              auVar122._28_4_ = uVar96;
              auVar217 = vcmpps_avx(_local_7e0,auVar122,2);
              auVar121 = vandps_avx(auVar217,local_5e0);
              auVar179 = ZEXT3264(auVar121);
              auVar217 = local_5e0 & auVar217;
              uVar97 = local_620;
              local_5e0 = auVar121;
            } while ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar217 >> 0x7f,0) != '\0') ||
                       (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar217 >> 0xbf,0) != '\0') ||
                     (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar217[0x1f] < '\0');
          }
          auVar125._0_4_ = auVar302._0_4_ * (float)local_8a0._0_4_;
          auVar125._4_4_ = auVar302._4_4_ * (float)local_8a0._4_4_;
          auVar125._8_4_ = auVar302._8_4_ * fStack_898;
          auVar125._12_4_ = auVar302._12_4_ * fStack_894;
          auVar125._16_4_ = auVar302._16_4_ * fStack_890;
          auVar125._20_4_ = auVar302._20_4_ * fStack_88c;
          auVar125._28_36_ = auVar179._28_36_;
          auVar125._24_4_ = auVar302._24_4_ * fStack_888;
          auVar5 = vfmadd132ps_fma(local_880,auVar125._0_32_,_local_820);
          auVar5 = vfmadd213ps_fma(_local_860,_local_a00,ZEXT1632(auVar5));
          auVar66._4_4_ = uStack_83c;
          auVar66._0_4_ = local_840;
          auVar66._8_4_ = uStack_838;
          auVar66._12_4_ = uStack_834;
          auVar66._16_4_ = uStack_830;
          auVar66._20_4_ = uStack_82c;
          auVar66._24_4_ = uStack_828;
          auVar66._28_4_ = uStack_824;
          auVar121 = vandps_avx(ZEXT1632(auVar5),auVar66);
          auVar152._8_4_ = 0x3e99999a;
          auVar152._0_8_ = 0x3e99999a3e99999a;
          auVar152._12_4_ = 0x3e99999a;
          auVar152._16_4_ = 0x3e99999a;
          auVar152._20_4_ = 0x3e99999a;
          auVar152._24_4_ = 0x3e99999a;
          auVar152._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar152,1);
          auVar217 = vorps_avx(auVar121,local_5a0);
          auVar153._0_4_ = fVar126 + (float)local_560._0_4_;
          auVar153._4_4_ = fVar126 + (float)local_560._4_4_;
          auVar153._8_4_ = fVar126 + fStack_558;
          auVar153._12_4_ = fVar126 + fStack_554;
          auVar153._16_4_ = fVar126 + fStack_550;
          auVar153._20_4_ = fVar126 + fStack_54c;
          auVar153._24_4_ = fVar126 + fStack_548;
          auVar153._28_4_ = fVar126 + fStack_544;
          uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar177._4_4_ = uVar96;
          auVar177._0_4_ = uVar96;
          auVar177._8_4_ = uVar96;
          auVar177._12_4_ = uVar96;
          auVar177._16_4_ = uVar96;
          auVar177._20_4_ = uVar96;
          auVar177._24_4_ = uVar96;
          auVar177._28_4_ = uVar96;
          auVar121 = vcmpps_avx(auVar153,auVar177,2);
          local_880 = vandps_avx(auVar121,local_580);
          auVar154._8_4_ = 3;
          auVar154._0_8_ = 0x300000003;
          auVar154._12_4_ = 3;
          auVar154._16_4_ = 3;
          auVar154._20_4_ = 3;
          auVar154._24_4_ = 3;
          auVar154._28_4_ = 3;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar178,auVar154,auVar217);
          _local_8a0 = vpcmpgtd_avx2(auVar121,local_5c0);
          auVar121 = vpandn_avx2(_local_8a0,local_880);
          auVar217 = local_880 & ~_local_8a0;
          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar217 >> 0x7f,0) != '\0') ||
                (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0xbf,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar217[0x1f] < '\0') {
            auVar110 = vminps_avx(local_a30,local_a50);
            auVar5 = vmaxps_avx(local_a30,local_a50);
            auVar279 = vminps_avx(local_a40,_local_a60);
            auVar306 = vminps_avx(auVar110,auVar279);
            auVar110 = vmaxps_avx(local_a40,_local_a60);
            auVar279 = vmaxps_avx(auVar5,auVar110);
            auVar5 = vandps_avx(auVar306,local_a70);
            auVar110 = vandps_avx(auVar279,local_a70);
            auVar5 = vmaxps_avx(auVar5,auVar110);
            auVar110 = vmovshdup_avx(auVar5);
            auVar110 = vmaxss_avx(auVar110,auVar5);
            auVar5 = vshufpd_avx(auVar5,auVar5,1);
            auVar5 = vmaxss_avx(auVar5,auVar110);
            local_940._0_4_ = auVar5._0_4_ * 1.9073486e-06;
            local_7a0 = vshufps_avx(auVar279,auVar279,0xff);
            _local_7e0 = _local_2c0;
            local_860._4_4_ = (float)local_2c0._4_4_ + fVar126;
            local_860._0_4_ = (float)local_2c0._0_4_ + fVar126;
            fStack_858 = fStack_2b8 + fVar126;
            fStack_854 = fStack_2b4 + fVar126;
            fStack_850 = fStack_2b0 + fVar126;
            fStack_84c = fStack_2ac + fVar126;
            fStack_848 = fStack_2a8 + fVar126;
            fStack_844 = fStack_2a4 + fVar126;
            do {
              auVar155._8_4_ = 0x7f800000;
              auVar155._0_8_ = 0x7f8000007f800000;
              auVar155._12_4_ = 0x7f800000;
              auVar155._16_4_ = 0x7f800000;
              auVar155._20_4_ = 0x7f800000;
              auVar155._24_4_ = 0x7f800000;
              auVar155._28_4_ = 0x7f800000;
              auVar217 = vblendvps_avx(auVar155,_local_7e0,auVar121);
              auVar7 = vshufps_avx(auVar217,auVar217,0xb1);
              auVar7 = vminps_avx(auVar217,auVar7);
              auVar6 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar6);
              auVar6 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar6);
              auVar7 = vcmpps_avx(auVar217,auVar7,0);
              auVar6 = auVar121 & auVar7;
              auVar217 = auVar121;
              if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar6 >> 0x7f,0) != '\0') ||
                    (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0xbf,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar6[0x1f] < '\0') {
                auVar217 = vandps_avx(auVar7,auVar121);
              }
              local_7c0._0_8_ = uVar98;
              uVar91 = vmovmskps_avx(auVar217);
              iVar15 = 0;
              for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              uVar92 = iVar15 << 2;
              local_600 = auVar121;
              *(undefined4 *)(local_600 + uVar92) = 0;
              uVar91 = *(uint *)(local_500 + uVar92);
              uVar92 = *(uint *)(local_2a0 + uVar92);
              fVar260 = local_ae8;
              if ((float)local_920._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_920._0_4_);
              }
              auVar272 = ZEXT464(uVar92);
              auVar179 = ZEXT464(uVar91);
              local_740._0_4_ = fVar260 * 1.9073486e-06;
              lVar95 = 5;
              do {
                fVar260 = auVar272._0_4_;
                auVar109._4_4_ = fVar260;
                auVar109._0_4_ = fVar260;
                auVar109._8_4_ = fVar260;
                auVar109._12_4_ = fVar260;
                auVar110 = vfmadd213ps_fma(auVar109,local_910,_DAT_01feba10);
                fVar242 = auVar179._0_4_;
                fVar241 = 1.0 - fVar242;
                local_a20._0_16_ = ZEXT416((uint)fVar241);
                fVar229 = fVar242 * fVar242;
                auVar248 = SUB6416(ZEXT464(0x40400000),0);
                auVar232 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar104 = auVar179._0_16_;
                auVar279 = vfmadd213ss_fma(auVar248,auVar104,auVar232);
                auVar5 = vfmadd213ss_fma(auVar279,ZEXT416((uint)fVar229),
                                         SUB6416(ZEXT464(0x40000000),0));
                auVar306 = vfmadd213ss_fma(auVar248,ZEXT416((uint)fVar241),auVar232);
                auVar306 = vfmadd213ss_fma(auVar306,ZEXT416((uint)(fVar241 * fVar241)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar100 = fVar241 * fVar241 * -fVar242 * 0.5;
                fVar238 = auVar5._0_4_ * 0.5;
                fVar239 = auVar306._0_4_ * 0.5;
                fVar240 = fVar242 * fVar242 * -fVar241 * 0.5;
                auVar189._0_4_ = fVar240 * (float)local_a60._0_4_;
                auVar189._4_4_ = fVar240 * (float)local_a60._4_4_;
                auVar189._8_4_ = fVar240 * fStack_a58;
                auVar189._12_4_ = fVar240 * fStack_a54;
                auVar204._4_4_ = fVar239;
                auVar204._0_4_ = fVar239;
                auVar204._8_4_ = fVar239;
                auVar204._12_4_ = fVar239;
                auVar5 = vfmadd132ps_fma(auVar204,auVar189,local_a40);
                auVar164._4_4_ = fVar238;
                auVar164._0_4_ = fVar238;
                auVar164._8_4_ = fVar238;
                auVar164._12_4_ = fVar238;
                auVar5 = vfmadd132ps_fma(auVar164,auVar5,local_a50);
                auVar190._4_4_ = fVar100;
                auVar190._0_4_ = fVar100;
                auVar190._8_4_ = fVar100;
                auVar190._12_4_ = fVar100;
                auVar5 = vfmadd132ps_fma(auVar190,auVar5,local_a30);
                auVar232 = vfmadd231ss_fma(auVar232,auVar104,ZEXT416(0x41100000));
                auVar306 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar104,
                                           ZEXT416(0x40800000));
                local_9e0._0_16_ = auVar306;
                local_700._0_16_ = auVar5;
                auVar5 = vsubps_avx(auVar110,auVar5);
                _local_900 = auVar5;
                auVar5 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar110 = vfmadd213ss_fma(auVar248,auVar104,ZEXT416(0xbf800000));
                local_aa0._0_16_ = auVar110;
                fVar100 = auVar5._0_4_;
                if (fVar100 < 0.0) {
                  local_ac0._0_4_ = auVar279._0_4_;
                  local_ae0._0_4_ = fVar229;
                  local_980._0_4_ = fVar241 * -2.0;
                  local_a20._0_16_ = ZEXT416((uint)fVar241);
                  auVar287._0_4_ = sqrtf(fVar100);
                  auVar287._4_60_ = extraout_var_00;
                  auVar279 = ZEXT416((uint)local_ac0._0_4_);
                  auVar110 = auVar287._0_16_;
                  fVar238 = (float)local_980._0_4_;
                  fVar229 = (float)local_ae0._0_4_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar5,auVar5);
                  fVar238 = fVar241 * -2.0;
                }
                fVar239 = local_a20._0_4_;
                auVar279 = vfmadd213ss_fma(auVar279,ZEXT416((uint)(fVar242 + fVar242)),
                                           ZEXT416((uint)(fVar242 * fVar242 * 3.0)));
                auVar158 = SUB6416(ZEXT464(0x40000000),0);
                auVar306 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar104,auVar158);
                auVar248 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar239 * -3.0)),
                                           ZEXT416((uint)(fVar239 + fVar239)),auVar306);
                auVar103 = vfnmadd231ss_fma(ZEXT416((uint)(fVar242 * (fVar239 + fVar239))),
                                            local_a20._0_16_,local_a20._0_16_);
                auVar306 = vfmadd213ss_fma(ZEXT416((uint)fVar238),auVar104,ZEXT416((uint)fVar229));
                fVar229 = auVar103._0_4_ * 0.5;
                fVar238 = auVar279._0_4_ * 0.5;
                fVar239 = auVar248._0_4_ * 0.5;
                fVar240 = auVar306._0_4_ * 0.5;
                auVar191._0_4_ = (float)local_a60._0_4_ * fVar240;
                auVar191._4_4_ = (float)local_a60._4_4_ * fVar240;
                auVar191._8_4_ = fStack_a58 * fVar240;
                auVar191._12_4_ = fStack_a54 * fVar240;
                auVar165._4_4_ = fVar239;
                auVar165._0_4_ = fVar239;
                auVar165._8_4_ = fVar239;
                auVar165._12_4_ = fVar239;
                auVar279 = vfmadd213ps_fma(auVar165,local_a40,auVar191);
                auVar136._4_4_ = fVar238;
                auVar136._0_4_ = fVar238;
                auVar136._8_4_ = fVar238;
                auVar136._12_4_ = fVar238;
                auVar279 = vfmadd213ps_fma(auVar136,local_a50,auVar279);
                auVar281._4_4_ = fVar229;
                auVar281._0_4_ = fVar229;
                auVar281._8_4_ = fVar229;
                auVar281._12_4_ = fVar229;
                local_a20._0_16_ = vfmadd213ps_fma(auVar281,local_a30,auVar279);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar104,auVar158);
                auVar111._0_4_ = (float)local_a60._0_4_ * (float)local_aa0._0_4_;
                auVar111._4_4_ = (float)local_a60._4_4_ * (float)local_aa0._0_4_;
                auVar111._8_4_ = fStack_a58 * (float)local_aa0._0_4_;
                auVar111._12_4_ = fStack_a54 * (float)local_aa0._0_4_;
                auVar166._4_4_ = local_9e0._0_4_;
                auVar166._0_4_ = local_9e0._0_4_;
                auVar166._8_4_ = local_9e0._0_4_;
                auVar166._12_4_ = local_9e0._0_4_;
                auVar279 = vfmadd213ps_fma(auVar166,local_a40,auVar111);
                uVar96 = auVar232._0_4_;
                auVar192._4_4_ = uVar96;
                auVar192._0_4_ = uVar96;
                auVar192._8_4_ = uVar96;
                auVar192._12_4_ = uVar96;
                auVar279 = vfmadd213ps_fma(auVar192,local_a50,auVar279);
                auVar306 = vdpps_avx(local_a20._0_16_,local_a20._0_16_,0x7f);
                auVar137._0_4_ = auVar248._0_4_;
                auVar137._4_4_ = auVar137._0_4_;
                auVar137._8_4_ = auVar137._0_4_;
                auVar137._12_4_ = auVar137._0_4_;
                auVar248 = vfmadd213ps_fma(auVar137,local_a30,auVar279);
                auVar279 = vblendps_avx(auVar306,_DAT_01feba10,0xe);
                auVar232 = vrsqrtss_avx(auVar279,auVar279);
                fVar239 = auVar306._0_4_;
                fVar229 = auVar232._0_4_;
                auVar232 = vdpps_avx(local_a20._0_16_,auVar248,0x7f);
                fVar229 = fVar229 * 1.5 + fVar239 * -0.5 * fVar229 * fVar229 * fVar229;
                auVar138._0_4_ = auVar248._0_4_ * fVar239;
                auVar138._4_4_ = auVar248._4_4_ * fVar239;
                auVar138._8_4_ = auVar248._8_4_ * fVar239;
                auVar138._12_4_ = auVar248._12_4_ * fVar239;
                fVar238 = auVar232._0_4_;
                auVar216._0_4_ = local_a20._0_4_ * fVar238;
                auVar216._4_4_ = local_a20._4_4_ * fVar238;
                fVar240 = local_a20._8_4_;
                auVar216._8_4_ = fVar240 * fVar238;
                fVar241 = local_a20._12_4_;
                auVar216._12_4_ = fVar241 * fVar238;
                auVar232 = vsubps_avx(auVar138,auVar216);
                auVar279 = vrcpss_avx(auVar279,auVar279);
                auVar248 = vfnmadd213ss_fma(auVar279,auVar306,auVar158);
                fVar238 = auVar279._0_4_ * auVar248._0_4_;
                auVar279 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar260 * (float)local_740._0_4_)));
                auVar265 = ZEXT1664(auVar279);
                local_ac0._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                local_ac0._8_4_ = -fVar240;
                local_ac0._12_4_ = -fVar241;
                auVar193._0_4_ = fVar229 * auVar232._0_4_ * fVar238;
                auVar193._4_4_ = fVar229 * auVar232._4_4_ * fVar238;
                auVar193._8_4_ = fVar229 * auVar232._8_4_ * fVar238;
                auVar193._12_4_ = fVar229 * auVar232._12_4_ * fVar238;
                auVar233._0_4_ = local_a20._0_4_ * fVar229;
                auVar233._4_4_ = local_a20._4_4_ * fVar229;
                auVar233._8_4_ = fVar240 * fVar229;
                auVar233._12_4_ = fVar241 * fVar229;
                local_9e0._0_4_ = auVar279._0_4_;
                if (fVar239 < -fVar239) {
                  local_aa0._0_4_ = auVar110._0_4_;
                  local_ae0._0_16_ = auVar233;
                  fVar229 = sqrtf(fVar239);
                  auVar265 = ZEXT464((uint)local_9e0._0_4_);
                  auVar110 = ZEXT416((uint)local_aa0._0_4_);
                  auVar233 = local_ae0._0_16_;
                }
                else {
                  auVar279 = vsqrtss_avx(auVar306,auVar306);
                  fVar229 = auVar279._0_4_;
                }
                auVar279 = vdpps_avx(_local_900,auVar233,0x7f);
                auVar248 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar110,auVar265._0_16_);
                auVar306 = vdpps_avx(local_ac0._0_16_,auVar233,0x7f);
                auVar232 = vdpps_avx(_local_900,auVar193,0x7f);
                local_aa0._0_16_ = vdpps_avx(local_910,auVar233,0x7f);
                auVar248 = vfmadd213ss_fma(ZEXT416((uint)(auVar110._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_940._0_4_ / fVar229)),
                                           auVar248);
                auVar293 = ZEXT1664(auVar248);
                fVar229 = auVar306._0_4_ + auVar232._0_4_;
                auVar112._0_4_ = auVar279._0_4_ * auVar279._0_4_;
                auVar112._4_4_ = auVar279._4_4_ * auVar279._4_4_;
                auVar112._8_4_ = auVar279._8_4_ * auVar279._8_4_;
                auVar112._12_4_ = auVar279._12_4_ * auVar279._12_4_;
                auVar110 = vdpps_avx(_local_900,local_ac0._0_16_,0x7f);
                auVar232 = vsubps_avx(auVar5,auVar112);
                auVar306 = vrsqrtss_avx(auVar232,auVar232);
                fVar239 = auVar232._0_4_;
                fVar238 = auVar306._0_4_;
                fVar238 = fVar238 * 1.5 + fVar239 * -0.5 * fVar238 * fVar238 * fVar238;
                auVar306 = vdpps_avx(_local_900,local_910,0x7f);
                local_ac0._0_16_ = vfnmadd231ss_fma(auVar110,auVar279,ZEXT416((uint)fVar229));
                auVar256 = ZEXT1664(local_ac0._0_16_);
                auVar110 = vfnmadd231ss_fma(auVar306,auVar279,local_aa0._0_16_);
                if (fVar239 < 0.0) {
                  local_ae0._0_16_ = auVar279;
                  local_980._0_16_ = ZEXT416((uint)fVar229);
                  local_760._0_4_ = fVar238;
                  local_780._0_16_ = auVar110;
                  auVar256 = ZEXT1664(local_ac0._0_16_);
                  fVar239 = sqrtf(fVar239);
                  auVar293 = ZEXT464(auVar248._0_4_);
                  auVar265 = ZEXT464((uint)local_9e0._0_4_);
                  fVar238 = (float)local_760._0_4_;
                  auVar110 = local_780._0_16_;
                  auVar279 = local_ae0._0_16_;
                  auVar306 = local_980._0_16_;
                }
                else {
                  auVar306 = vsqrtss_avx(auVar232,auVar232);
                  fVar239 = auVar306._0_4_;
                  auVar306 = ZEXT416((uint)fVar229);
                }
                auVar287 = ZEXT1664(auVar279);
                auVar232 = vpermilps_avx(local_700._0_16_,0xff);
                auVar248 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
                auVar104 = vfmsub213ss_fma(local_ac0._0_16_,ZEXT416((uint)fVar238),auVar248);
                auVar194._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = local_aa0._8_4_ ^ 0x80000000;
                auVar194._12_4_ = local_aa0._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar104._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar110 = ZEXT416((uint)(auVar110._0_4_ * fVar238));
                auVar104 = vfmsub231ss_fma(ZEXT416((uint)(auVar104._0_4_ * local_aa0._0_4_)),
                                           auVar306,auVar110);
                auVar110 = vinsertps_avx(auVar110,auVar194,0x10);
                uVar96 = auVar104._0_4_;
                auVar195._4_4_ = uVar96;
                auVar195._0_4_ = uVar96;
                auVar195._8_4_ = uVar96;
                auVar195._12_4_ = uVar96;
                auVar110 = vdivps_avx(auVar110,auVar195);
                auVar104 = ZEXT416((uint)(fVar239 - auVar232._0_4_));
                auVar232 = vinsertps_avx(auVar279,auVar104,0x10);
                auVar167._0_4_ = auVar232._0_4_ * auVar110._0_4_;
                auVar167._4_4_ = auVar232._4_4_ * auVar110._4_4_;
                auVar167._8_4_ = auVar232._8_4_ * auVar110._8_4_;
                auVar167._12_4_ = auVar232._12_4_ * auVar110._12_4_;
                auVar110 = vinsertps_avx(auVar205,auVar306,0x1c);
                auVar110 = vdivps_avx(auVar110,auVar195);
                auVar306 = vhaddps_avx(auVar167,auVar167);
                auVar196._0_4_ = auVar232._0_4_ * auVar110._0_4_;
                auVar196._4_4_ = auVar232._4_4_ * auVar110._4_4_;
                auVar196._8_4_ = auVar232._8_4_ * auVar110._8_4_;
                auVar196._12_4_ = auVar232._12_4_ * auVar110._12_4_;
                auVar110 = vhaddps_avx(auVar196,auVar196);
                fVar242 = fVar242 - auVar306._0_4_;
                auVar179 = ZEXT464((uint)fVar242);
                fVar260 = fVar260 - auVar110._0_4_;
                auVar272 = ZEXT464((uint)fVar260);
                auVar110 = vandps_avx(auVar279,local_a70);
                bVar49 = true;
                if (auVar110._0_4_ < auVar293._0_4_) {
                  auVar306 = vfmadd231ss_fma(ZEXT416((uint)(auVar265._0_4_ + auVar293._0_4_)),
                                             local_7a0,ZEXT416(0x36000000));
                  auVar110 = vandps_avx(auVar104,local_a70);
                  if (auVar110._0_4_ < auVar306._0_4_) {
                    fVar260 = fVar260 + (float)local_8d0._0_4_;
                    auVar272 = ZEXT464((uint)fVar260);
                    if ((((fVar99 <= fVar260) &&
                         (fVar229 = *(float *)(ray + k * 4 + 0x80), fVar260 <= fVar229)) &&
                        (0.0 <= fVar242)) && (fVar242 <= 1.0)) {
                      auVar5 = vrsqrtss_avx(auVar5,auVar5);
                      fVar238 = auVar5._0_4_;
                      pGVar3 = (context->scene->geometries).items[local_af0].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar100 = fVar238 * 1.5 + fVar100 * -0.5 * fVar238 * fVar238 * fVar238;
                          auVar139._0_4_ = fVar100 * (float)local_900._0_4_;
                          auVar139._4_4_ = fVar100 * (float)local_900._4_4_;
                          auVar139._8_4_ = fVar100 * fStack_8f8;
                          auVar139._12_4_ = fVar100 * fStack_8f4;
                          auVar232 = vfmadd213ps_fma(auVar248,auVar139,local_a20._0_16_);
                          auVar5 = vshufps_avx(auVar139,auVar139,0xc9);
                          auVar110 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                          auVar140._0_4_ = auVar139._0_4_ * auVar110._0_4_;
                          auVar140._4_4_ = auVar139._4_4_ * auVar110._4_4_;
                          auVar140._8_4_ = auVar139._8_4_ * auVar110._8_4_;
                          auVar140._12_4_ = auVar139._12_4_ * auVar110._12_4_;
                          auVar306 = vfmsub231ps_fma(auVar140,local_a20._0_16_,auVar5);
                          auVar5 = vshufps_avx(auVar306,auVar306,0xc9);
                          auVar110 = vshufps_avx(auVar232,auVar232,0xc9);
                          auVar306 = vshufps_avx(auVar306,auVar306,0xd2);
                          auVar113._0_4_ = auVar232._0_4_ * auVar306._0_4_;
                          auVar113._4_4_ = auVar232._4_4_ * auVar306._4_4_;
                          auVar113._8_4_ = auVar232._8_4_ * auVar306._8_4_;
                          auVar113._12_4_ = auVar232._12_4_ * auVar306._12_4_;
                          auVar5 = vfmsub231ps_fma(auVar113,auVar5,auVar110);
                          local_6c0 = (RTCHitN  [16])vshufps_avx(auVar5,auVar5,0x55);
                          auStack_6b0 = vshufps_avx(auVar5,auVar5,0xaa);
                          local_6a0 = auVar5._0_4_;
                          local_680 = ZEXT416(0) << 0x20;
                          local_670 = CONCAT44(uStack_6dc,local_6e0);
                          uStack_668 = CONCAT44(uStack_6d4,uStack_6d8);
                          local_660._4_4_ = uStack_6cc;
                          local_660._0_4_ = local_6d0;
                          local_660._8_4_ = uStack_6c8;
                          local_660._12_4_ = uStack_6c4;
                          vpcmpeqd_avx2(ZEXT1632(local_660),ZEXT1632(local_660));
                          uStack_64c = context->user->instID[0];
                          local_650 = uStack_64c;
                          uStack_648 = uStack_64c;
                          uStack_644 = uStack_64c;
                          uStack_640 = context->user->instPrimID[0];
                          uStack_63c = uStack_640;
                          uStack_638 = uStack_640;
                          uStack_634 = uStack_640;
                          *(float *)(ray + k * 4 + 0x80) = fVar260;
                          local_b00 = *local_9b8;
                          uStack_af8 = local_9b8[1];
                          local_9b0.valid = (int *)&local_b00;
                          local_9b0.geometryUserPtr = pGVar3->userPtr;
                          local_9b0.context = context->user;
                          local_9b0.hit = local_6c0;
                          local_9b0.N = 4;
                          local_9b0.ray = (RTCRayN *)ray;
                          uStack_69c = local_6a0;
                          uStack_698 = local_6a0;
                          uStack_694 = local_6a0;
                          local_690 = fVar242;
                          fStack_68c = fVar242;
                          fStack_688 = fVar242;
                          fStack_684 = fVar242;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar256 = ZEXT1664(auVar256._0_16_);
                            auVar287 = ZEXT1664(auVar279);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_9b0);
                            auVar272 = ZEXT1664(ZEXT416((uint)fVar260));
                            auVar179 = ZEXT1664(ZEXT416((uint)fVar242));
                          }
                          auVar60._8_8_ = uStack_af8;
                          auVar60._0_8_ = local_b00;
                          if (auVar60 == (undefined1  [16])0x0) {
                            auVar5 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar5 = auVar5 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              auVar287 = ZEXT1664(auVar287._0_16_);
                              auVar293 = ZEXT1664(auVar293._0_16_);
                              (*p_Var4)(&local_9b0);
                              auVar272 = ZEXT1664(ZEXT416((uint)fVar260));
                              auVar179 = ZEXT1664(ZEXT416((uint)fVar242));
                            }
                            auVar61._8_8_ = uStack_af8;
                            auVar61._0_8_ = local_b00;
                            auVar110 = vpcmpeqd_avx((undefined1  [16])0x0,auVar61);
                            auVar5 = auVar110 ^ _DAT_01febe20;
                            auVar168._8_4_ = 0xff800000;
                            auVar168._0_8_ = 0xff800000ff800000;
                            auVar168._12_4_ = 0xff800000;
                            auVar110 = vblendvps_avx(auVar168,*(undefined1 (*) [16])
                                                               (local_9b0.ray + 0x80),auVar110);
                            *(undefined1 (*) [16])(local_9b0.ray + 0x80) = auVar110;
                          }
                          auVar141._8_8_ = 0x100000001;
                          auVar141._0_8_ = 0x100000001;
                          unaff_BL = (auVar141 & auVar5) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar229;
                          }
                        }
                        bVar49 = false;
                        goto LAB_016bcadf;
                      }
                    }
                    bVar49 = false;
                    unaff_BL = 0;
                  }
                }
LAB_016bcadf:
                if (!bVar49) goto LAB_016bcdd1;
                lVar95 = lVar95 + -1;
              } while (lVar95 != 0);
              unaff_BL = 0;
LAB_016bcdd1:
              unaff_BL = unaff_BL & 1;
              uVar98 = CONCAT71(local_7c0._1_7_,local_7c0[0] | unaff_BL);
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar123._4_4_ = uVar96;
              auVar123._0_4_ = uVar96;
              auVar123._8_4_ = uVar96;
              auVar123._12_4_ = uVar96;
              auVar123._16_4_ = uVar96;
              auVar123._20_4_ = uVar96;
              auVar123._24_4_ = uVar96;
              auVar123._28_4_ = uVar96;
              auVar217 = vcmpps_avx(_local_860,auVar123,2);
              auVar121 = vandps_avx(auVar217,local_600);
              local_600 = local_600 & auVar217;
              uVar97 = local_620;
            } while ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_600 >> 0x7f,0) != '\0') ||
                       (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_600 >> 0xbf,0) != '\0') ||
                     (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_600[0x1f] < '\0');
          }
          auVar156._0_4_ = fVar126 + local_300._0_4_;
          auVar156._4_4_ = fVar126 + local_300._4_4_;
          auVar156._8_4_ = fVar126 + local_300._8_4_;
          auVar156._12_4_ = fVar126 + local_300._12_4_;
          auVar156._16_4_ = fVar126 + local_300._16_4_;
          auVar156._20_4_ = fVar126 + local_300._20_4_;
          auVar156._24_4_ = fVar126 + local_300._24_4_;
          auVar156._28_4_ = fVar126 + local_300._28_4_;
          uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar199._4_4_ = uVar96;
          auVar199._0_4_ = uVar96;
          auVar199._8_4_ = uVar96;
          auVar199._12_4_ = uVar96;
          auVar199._16_4_ = uVar96;
          auVar199._20_4_ = uVar96;
          auVar199._24_4_ = uVar96;
          auVar199._28_4_ = uVar96;
          auVar217 = vcmpps_avx(auVar156,auVar199,2);
          auVar121 = vandps_avx(local_540,local_520);
          auVar121 = vandps_avx(auVar217,auVar121);
          auVar206._0_4_ = fVar126 + local_2c0._0_4_;
          auVar206._4_4_ = fVar126 + local_2c0._4_4_;
          auVar206._8_4_ = fVar126 + local_2c0._8_4_;
          auVar206._12_4_ = fVar126 + local_2c0._12_4_;
          auVar206._16_4_ = fVar126 + local_2c0._16_4_;
          auVar206._20_4_ = fVar126 + local_2c0._20_4_;
          auVar206._24_4_ = fVar126 + local_2c0._24_4_;
          auVar206._28_4_ = fVar126 + local_2c0._28_4_;
          auVar7 = vcmpps_avx(auVar206,auVar199,2);
          auVar217 = vandps_avx(_local_8a0,local_880);
          auVar217 = vandps_avx(auVar7,auVar217);
          auVar217 = vorps_avx(auVar121,auVar217);
          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar217 >> 0x7f,0) != '\0') ||
                (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0xbf,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar217[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar217;
            auVar121 = vblendvps_avx(_local_2c0,local_300,auVar121);
            *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar121;
            uVar1 = vmovlps_avx(local_8c0);
            *(undefined8 *)(afStack_140 + uVar94 * 0x18) = uVar1;
            auStack_138[uVar94 * 0x18] = (int)uVar97 + 1;
            uVar94 = (ulong)((int)uVar94 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar94 == 0) {
        if ((uVar98 & 1) != 0) {
          return local_bb1;
        }
        uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar114._4_4_ = uVar96;
        auVar114._0_4_ = uVar96;
        auVar114._8_4_ = uVar96;
        auVar114._12_4_ = uVar96;
        auVar5 = vcmpps_avx(local_4b0,auVar114,2);
        uVar91 = vmovmskps_avx(auVar5);
        uVar91 = (uint)local_8a8 & uVar91;
        local_bb1 = uVar91 != 0;
        if (!local_bb1) {
          return local_bb1;
        }
        goto LAB_016ba5fe;
      }
      uVar93 = (ulong)((int)uVar94 - 1);
      lVar95 = uVar93 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar119._0_4_ = fVar126 + auVar121._0_4_;
      auVar119._4_4_ = fVar126 + auVar121._4_4_;
      auVar119._8_4_ = fVar126 + auVar121._8_4_;
      auVar119._12_4_ = fVar126 + auVar121._12_4_;
      auVar119._16_4_ = fVar126 + auVar121._16_4_;
      auVar119._20_4_ = fVar126 + auVar121._20_4_;
      auVar119._24_4_ = fVar126 + auVar121._24_4_;
      auVar119._28_4_ = fVar126 + auVar121._28_4_;
      uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar198._4_4_ = uVar96;
      auVar198._0_4_ = uVar96;
      auVar198._8_4_ = uVar96;
      auVar198._12_4_ = uVar96;
      auVar198._16_4_ = uVar96;
      auVar198._20_4_ = uVar96;
      auVar198._24_4_ = uVar96;
      auVar198._28_4_ = uVar96;
      auVar217 = vcmpps_avx(auVar119,auVar198,2);
      _local_6c0 = vandps_avx(auVar217,*(undefined1 (*) [32])(auStack_180 + lVar95));
      auVar217 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar217;
      bVar56 = (auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar55 = (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar217 >> 0x7f,0) == '\0';
      bVar53 = (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = SUB321(auVar217 >> 0xbf,0) == '\0';
      bVar50 = (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar49 = -1 < auVar217[0x1f];
      if (((((((!bVar56 || !bVar57) || !bVar55) || !bVar54) || !bVar53) || !bVar52) || !bVar50) ||
          !bVar49) {
        auVar175._8_4_ = 0x7f800000;
        auVar175._0_8_ = 0x7f8000007f800000;
        auVar175._12_4_ = 0x7f800000;
        auVar175._16_4_ = 0x7f800000;
        auVar175._20_4_ = 0x7f800000;
        auVar175._24_4_ = 0x7f800000;
        auVar175._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar175,auVar121,_local_6c0);
        auVar217 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar217 = vminps_avx(auVar121,auVar217);
        auVar7 = vshufpd_avx(auVar217,auVar217,5);
        auVar217 = vminps_avx(auVar217,auVar7);
        auVar7 = vpermpd_avx2(auVar217,0x4e);
        auVar217 = vminps_avx(auVar217,auVar7);
        auVar217 = vcmpps_avx(auVar121,auVar217,0);
        auVar7 = _local_6c0 & auVar217;
        auVar121 = _local_6c0;
        if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0x7f,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar7 >> 0xbf,0) != '\0') ||
            (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar7[0x1f] < '\0') {
          auVar121 = vandps_avx(auVar217,_local_6c0);
        }
        fVar260 = afStack_140[uVar93 * 0x18 + 1];
        uVar97 = (ulong)auStack_138[uVar93 * 0x18];
        uVar91 = vmovmskps_avx(auVar121);
        iVar15 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          iVar15 = iVar15 + 1;
        }
        fVar229 = afStack_140[uVar93 * 0x18];
        auVar120._4_4_ = fVar229;
        auVar120._0_4_ = fVar229;
        auVar120._8_4_ = fVar229;
        auVar120._12_4_ = fVar229;
        auVar120._16_4_ = fVar229;
        auVar120._20_4_ = fVar229;
        auVar120._24_4_ = fVar229;
        auVar120._28_4_ = fVar229;
        *(undefined4 *)(local_6c0 + (uint)(iVar15 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar95) = _local_6c0;
        if ((((((((_local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_6c0 >> 0x7f,0) != '\0') ||
              (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_6c0 >> 0xbf,0) != '\0') ||
            (_local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_6c0[0x1f] < '\0') {
          uVar93 = uVar94;
        }
        fVar260 = fVar260 - fVar229;
        auVar148._4_4_ = fVar260;
        auVar148._0_4_ = fVar260;
        auVar148._8_4_ = fVar260;
        auVar148._12_4_ = fVar260;
        auVar148._16_4_ = fVar260;
        auVar148._20_4_ = fVar260;
        auVar148._24_4_ = fVar260;
        auVar148._28_4_ = fVar260;
        auVar5 = vfmadd132ps_fma(auVar148,auVar120,_DAT_02020f20);
        local_300 = ZEXT1632(auVar5);
        local_8c0._8_8_ = 0;
        local_8c0._0_8_ = *(ulong *)(local_300 + (uint)(iVar15 << 2));
      }
      uVar94 = uVar93;
      fVar260 = fVar126;
    } while (((((((bVar56 && bVar57) && bVar55) && bVar54) && bVar53) && bVar52) && bVar50) &&
             bVar49);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }